

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [60];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 in_R11;
  ulong uVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar86 [16];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  float t1;
  float fVar140;
  undefined4 uVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vfloat4 a0_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vfloat4 b0;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  vfloat4 a0_3;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  __m128 a_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  __m128 a;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar225;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar238;
  float fVar239;
  vfloat4 a0_1;
  undefined1 auVar228 [16];
  float fVar240;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar241;
  float fVar246;
  float fVar247;
  vfloat4 a0;
  undefined1 auVar242 [16];
  float fVar248;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_628;
  RTCFilterFunctionNArguments local_620;
  uint auStack_5f0 [4];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar55;
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar127 [64];
  undefined1 auVar252 [32];
  
  uVar54 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar66 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar67 = vsubps_avx(auVar64,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  fVar151 = fVar1 * auVar67._0_4_;
  fVar131 = fVar1 * auVar66._0_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar54 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar64);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar54 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar72);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar54 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar5);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar54 * 0xb + 6);
  auVar111 = vpmovsxbd_avx2(auVar73);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar54 * 0xc + 6);
  auVar112 = vpmovsxbd_avx2(auVar74);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar54 * 0xd + 6);
  auVar102 = vpmovsxbd_avx2(auVar69);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar54 * 0x12 + 6);
  auVar103 = vpmovsxbd_avx2(auVar75);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar54 * 0x13 + 6);
  auVar106 = vpmovsxbd_avx2(auVar76);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar54 * 0x14 + 6);
  auVar97 = vpmovsxbd_avx2(auVar65);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar97);
  auVar162._4_4_ = fVar131;
  auVar162._0_4_ = fVar131;
  auVar162._8_4_ = fVar131;
  auVar162._12_4_ = fVar131;
  auVar162._16_4_ = fVar131;
  auVar162._20_4_ = fVar131;
  auVar162._24_4_ = fVar131;
  auVar162._28_4_ = fVar131;
  auVar258._8_4_ = 1;
  auVar258._0_8_ = 0x100000001;
  auVar258._12_4_ = 1;
  auVar258._16_4_ = 1;
  auVar258._20_4_ = 1;
  auVar258._24_4_ = 1;
  auVar258._28_4_ = 1;
  auVar107 = ZEXT1632(CONCAT412(fVar1 * auVar66._12_4_,
                                CONCAT48(fVar1 * auVar66._8_4_,
                                         CONCAT44(fVar1 * auVar66._4_4_,fVar131))));
  auVar98 = vpermps_avx2(auVar258,auVar107);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = vpermps_avx512vl(auVar95,auVar107);
  fVar131 = auVar96._0_4_;
  fVar216 = auVar96._4_4_;
  auVar107._4_4_ = fVar216 * auVar100._4_4_;
  auVar107._0_4_ = fVar131 * auVar100._0_4_;
  fVar225 = auVar96._8_4_;
  auVar107._8_4_ = fVar225 * auVar100._8_4_;
  fVar226 = auVar96._12_4_;
  auVar107._12_4_ = fVar226 * auVar100._12_4_;
  fVar137 = auVar96._16_4_;
  auVar107._16_4_ = fVar137 * auVar100._16_4_;
  fVar138 = auVar96._20_4_;
  auVar107._20_4_ = fVar138 * auVar100._20_4_;
  fVar139 = auVar96._24_4_;
  auVar107._24_4_ = fVar139 * auVar100._24_4_;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar102._4_4_ * fVar216;
  auVar97._0_4_ = auVar102._0_4_ * fVar131;
  auVar97._8_4_ = auVar102._8_4_ * fVar225;
  auVar97._12_4_ = auVar102._12_4_ * fVar226;
  auVar97._16_4_ = auVar102._16_4_ * fVar137;
  auVar97._20_4_ = auVar102._20_4_ * fVar138;
  auVar97._24_4_ = auVar102._24_4_ * fVar139;
  auVar97._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar105._4_4_ * fVar216;
  auVar106._0_4_ = auVar105._0_4_ * fVar131;
  auVar106._8_4_ = auVar105._8_4_ * fVar225;
  auVar106._12_4_ = auVar105._12_4_ * fVar226;
  auVar106._16_4_ = auVar105._16_4_ * fVar137;
  auVar106._20_4_ = auVar105._20_4_ * fVar138;
  auVar106._24_4_ = auVar105._24_4_ * fVar139;
  auVar106._28_4_ = auVar96._28_4_;
  auVar64 = vfmadd231ps_fma(auVar107,auVar98,auVar99);
  auVar72 = vfmadd231ps_fma(auVar97,auVar98,auVar112);
  auVar5 = vfmadd231ps_fma(auVar106,auVar104,auVar98);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar162,auVar101);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar162,auVar111);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar103,auVar162);
  auVar170._4_4_ = fVar151;
  auVar170._0_4_ = fVar151;
  auVar170._8_4_ = fVar151;
  auVar170._12_4_ = fVar151;
  auVar170._16_4_ = fVar151;
  auVar170._20_4_ = fVar151;
  auVar170._24_4_ = fVar151;
  auVar170._28_4_ = fVar151;
  auVar97 = ZEXT1632(CONCAT412(fVar1 * auVar67._12_4_,
                               CONCAT48(fVar1 * auVar67._8_4_,
                                        CONCAT44(fVar1 * auVar67._4_4_,fVar151))));
  auVar106 = vpermps_avx2(auVar258,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  auVar98 = vmulps_avx512vl(auVar97,auVar100);
  auVar109._0_4_ = auVar97._0_4_ * auVar102._0_4_;
  auVar109._4_4_ = auVar97._4_4_ * auVar102._4_4_;
  auVar109._8_4_ = auVar97._8_4_ * auVar102._8_4_;
  auVar109._12_4_ = auVar97._12_4_ * auVar102._12_4_;
  auVar109._16_4_ = auVar97._16_4_ * auVar102._16_4_;
  auVar109._20_4_ = auVar97._20_4_ * auVar102._20_4_;
  auVar109._24_4_ = auVar97._24_4_ * auVar102._24_4_;
  auVar109._28_4_ = 0;
  auVar102._4_4_ = auVar97._4_4_ * auVar105._4_4_;
  auVar102._0_4_ = auVar97._0_4_ * auVar105._0_4_;
  auVar102._8_4_ = auVar97._8_4_ * auVar105._8_4_;
  auVar102._12_4_ = auVar97._12_4_ * auVar105._12_4_;
  auVar102._16_4_ = auVar97._16_4_ * auVar105._16_4_;
  auVar102._20_4_ = auVar97._20_4_ * auVar105._20_4_;
  auVar102._24_4_ = auVar97._24_4_ * auVar105._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar99 = vfmadd231ps_avx512vl(auVar98,auVar106,auVar99);
  auVar73 = vfmadd231ps_fma(auVar109,auVar106,auVar112);
  auVar74 = vfmadd231ps_fma(auVar102,auVar106,auVar104);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar170,auVar101);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar170,auVar111);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar170,auVar103);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  auVar101 = vandps_avx(ZEXT1632(auVar64),auVar113);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar101,auVar115,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar98._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar72),auVar113);
  uVar59 = vcmpps_avx512vl(auVar101,auVar115,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar95._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar72._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar5),auVar113);
  uVar59 = vcmpps_avx512vl(auVar101,auVar115,1);
  bVar62 = (bool)((byte)uVar59 & 1);
  auVar101._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar5._0_4_;
  bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar5._4_4_;
  bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar5._8_4_;
  bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar5._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar100 = vrcp14ps_avx512vl(auVar98);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar98,auVar100,auVar114);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar95);
  auVar72 = vfnmadd213ps_fma(auVar95,auVar100,auVar114);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar100,auVar100);
  auVar100 = vrcp14ps_avx512vl(auVar101);
  auVar5 = vfnmadd213ps_fma(auVar101,auVar100,auVar114);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar100,auVar100);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx512vl(auVar101,auVar99);
  auVar103._4_4_ = auVar64._4_4_ * auVar101._4_4_;
  auVar103._0_4_ = auVar64._0_4_ * auVar101._0_4_;
  auVar103._8_4_ = auVar64._8_4_ * auVar101._8_4_;
  auVar103._12_4_ = auVar64._12_4_ * auVar101._12_4_;
  auVar103._16_4_ = auVar101._16_4_ * 0.0;
  auVar103._20_4_ = auVar101._20_4_ * 0.0;
  auVar103._24_4_ = auVar101._24_4_ * 0.0;
  auVar103._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 9 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx512vl(auVar101,auVar99);
  auVar110._0_4_ = auVar64._0_4_ * auVar101._0_4_;
  auVar110._4_4_ = auVar64._4_4_ * auVar101._4_4_;
  auVar110._8_4_ = auVar64._8_4_ * auVar101._8_4_;
  auVar110._12_4_ = auVar64._12_4_ * auVar101._12_4_;
  auVar110._16_4_ = auVar101._16_4_ * 0.0;
  auVar110._20_4_ = auVar101._20_4_ * 0.0;
  auVar110._24_4_ = auVar101._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0xe + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar73));
  auVar104._4_4_ = auVar72._4_4_ * auVar101._4_4_;
  auVar104._0_4_ = auVar72._0_4_ * auVar101._0_4_;
  auVar104._8_4_ = auVar72._8_4_ * auVar101._8_4_;
  auVar104._12_4_ = auVar72._12_4_ * auVar101._12_4_;
  auVar104._16_4_ = auVar101._16_4_ * 0.0;
  auVar104._20_4_ = auVar101._20_4_ * 0.0;
  auVar104._24_4_ = auVar101._24_4_ * 0.0;
  auVar104._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar73));
  auVar108._0_4_ = auVar72._0_4_ * auVar101._0_4_;
  auVar108._4_4_ = auVar72._4_4_ * auVar101._4_4_;
  auVar108._8_4_ = auVar72._8_4_ * auVar101._8_4_;
  auVar108._12_4_ = auVar72._12_4_ * auVar101._12_4_;
  auVar108._16_4_ = auVar101._16_4_ * 0.0;
  auVar108._20_4_ = auVar101._20_4_ * 0.0;
  auVar108._24_4_ = auVar101._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0x15 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar74));
  auVar105._4_4_ = auVar101._4_4_ * auVar5._4_4_;
  auVar105._0_4_ = auVar101._0_4_ * auVar5._0_4_;
  auVar105._8_4_ = auVar101._8_4_ * auVar5._8_4_;
  auVar105._12_4_ = auVar101._12_4_ * auVar5._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar74));
  auVar96._0_4_ = auVar5._0_4_ * auVar101._0_4_;
  auVar96._4_4_ = auVar5._4_4_ * auVar101._4_4_;
  auVar96._8_4_ = auVar5._8_4_ * auVar101._8_4_;
  auVar96._12_4_ = auVar5._12_4_ * auVar101._12_4_;
  auVar96._16_4_ = auVar101._16_4_ * 0.0;
  auVar96._20_4_ = auVar101._20_4_ * 0.0;
  auVar96._24_4_ = auVar101._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar103,auVar110);
  auVar99 = vpminsd_avx2(auVar104,auVar108);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99 = vpminsd_avx2(auVar105,auVar96);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar100._4_4_ = uVar141;
  auVar100._0_4_ = uVar141;
  auVar100._8_4_ = uVar141;
  auVar100._12_4_ = uVar141;
  auVar100._16_4_ = uVar141;
  auVar100._20_4_ = uVar141;
  auVar100._24_4_ = uVar141;
  auVar100._28_4_ = uVar141;
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar101,auVar99);
  auVar101 = vpmaxsd_avx2(auVar103,auVar110);
  auVar99 = vpmaxsd_avx2(auVar104,auVar108);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar99 = vpmaxsd_avx2(auVar105,auVar96);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar111._4_4_ = uVar141;
  auVar111._0_4_ = uVar141;
  auVar111._8_4_ = uVar141;
  auVar111._12_4_ = uVar141;
  auVar111._16_4_ = uVar141;
  auVar111._20_4_ = uVar141;
  auVar111._24_4_ = uVar141;
  auVar111._28_4_ = uVar141;
  auVar99 = vminps_avx512vl(auVar99,auVar111);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar112);
  auVar99 = vpbroadcastd_avx512vl();
  uVar24 = vcmpps_avx512vl(local_3c0,auVar101,2);
  uVar25 = vpcmpgtd_avx512vl(auVar99,_DAT_01fb4ba0);
  uVar59 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar25));
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar268 = ZEXT1664(auVar64);
  auVar136 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar136);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar136 = ZEXT1664(auVar64);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar259 = ZEXT1664(auVar64);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar260 = ZEXT1664(auVar64);
  auVar267 = ZEXT464(0x3f800000);
LAB_01a33861:
  if (uVar59 == 0) {
    return;
  }
  lVar56 = 0;
  for (uVar54 = uVar59; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar64 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar54);
  lVar56 = uVar54 + 1;
  auVar72 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * lVar56);
  _Var11 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var11 + (long)pGVar9[2].userPtr * uVar54);
  auVar73 = *(undefined1 (*) [16])(_Var11 + (long)pGVar9[2].userPtr * lVar56);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar78 = auVar268._0_16_;
  auVar65 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * uVar54),
                       auVar64,auVar78);
  auVar66 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * lVar56),
                       auVar72,auVar78);
  auVar67 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar9[3].userPtr + uVar54 * *(long *)&pGVar9[3].fnumTimeSegments),
                       auVar5,auVar78);
  auVar68 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar9[3].userPtr + *(long *)&pGVar9[3].fnumTimeSegments * lVar56),
                       auVar73,auVar78);
  auVar80 = ZEXT816(0) << 0x40;
  auVar70._0_4_ = auVar72._0_4_ * 0.0;
  auVar70._4_4_ = auVar72._4_4_ * 0.0;
  auVar70._8_4_ = auVar72._8_4_ * 0.0;
  auVar70._12_4_ = auVar72._12_4_ * 0.0;
  auVar75 = vfmadd231ps_fma(auVar70,auVar66,auVar80);
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar65,auVar75);
  auVar81._0_4_ = auVar64._0_4_ + auVar69._0_4_;
  auVar81._4_4_ = auVar64._4_4_ + auVar69._4_4_;
  auVar81._8_4_ = auVar64._8_4_ + auVar69._8_4_;
  auVar81._12_4_ = auVar64._12_4_ + auVar69._12_4_;
  auVar77 = auVar136._0_16_;
  auVar69 = vfmadd231ps_avx512vl(auVar75,auVar65,auVar77);
  auVar70 = vfnmadd231ps_avx512vl(auVar69,auVar64,auVar77);
  auVar228._0_4_ = auVar73._0_4_ * 0.0;
  auVar228._4_4_ = auVar73._4_4_ * 0.0;
  auVar228._8_4_ = auVar73._8_4_ * 0.0;
  auVar228._12_4_ = auVar73._12_4_ * 0.0;
  auVar75 = vfmadd231ps_fma(auVar228,auVar68,auVar80);
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar67,auVar75);
  auVar242._0_4_ = auVar5._0_4_ + auVar69._0_4_;
  auVar242._4_4_ = auVar5._4_4_ + auVar69._4_4_;
  auVar242._8_4_ = auVar5._8_4_ + auVar69._8_4_;
  auVar242._12_4_ = auVar5._12_4_ + auVar69._12_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar75,auVar67,auVar77);
  auVar71 = vfnmadd231ps_avx512vl(auVar69,auVar5,auVar77);
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar66,auVar72);
  auVar69 = vfmadd231ps_fma(auVar69,auVar65,auVar80);
  auVar76 = vfmadd231ps_fma(auVar69,auVar64,auVar80);
  auVar72 = vmulps_avx512vl(auVar72,auVar77);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar77,auVar66);
  auVar72 = vfmadd231ps_fma(auVar72,auVar80,auVar65);
  auVar65 = vfnmadd231ps_fma(auVar72,auVar80,auVar64);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar68,auVar73);
  auVar64 = vfmadd231ps_fma(auVar64,auVar67,auVar80);
  auVar69 = vfmadd231ps_fma(auVar64,auVar5,auVar80);
  auVar64 = vmulps_avx512vl(auVar73,auVar77);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar77,auVar68);
  auVar64 = vfmadd231ps_fma(auVar64,auVar80,auVar67);
  auVar75 = vfnmadd231ps_fma(auVar64,auVar80,auVar5);
  auVar64 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar72 = vshufps_avx(auVar242,auVar242,0xc9);
  fVar140 = auVar70._0_4_;
  auVar82._0_4_ = fVar140 * auVar72._0_4_;
  fVar143 = auVar70._4_4_;
  auVar82._4_4_ = fVar143 * auVar72._4_4_;
  fVar144 = auVar70._8_4_;
  auVar82._8_4_ = fVar144 * auVar72._8_4_;
  fVar145 = auVar70._12_4_;
  auVar82._12_4_ = fVar145 * auVar72._12_4_;
  auVar72 = vfmsub231ps_fma(auVar82,auVar64,auVar242);
  auVar5 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar72 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar196._0_4_ = auVar72._0_4_ * fVar140;
  auVar196._4_4_ = auVar72._4_4_ * fVar143;
  auVar196._8_4_ = auVar72._8_4_ * fVar144;
  auVar196._12_4_ = auVar72._12_4_ * fVar145;
  auVar64 = vfmsub231ps_fma(auVar196,auVar64,auVar71);
  auVar73 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar64 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar72 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar131 = auVar65._0_4_;
  auVar207._0_4_ = auVar72._0_4_ * fVar131;
  fVar216 = auVar65._4_4_;
  auVar207._4_4_ = auVar72._4_4_ * fVar216;
  fVar225 = auVar65._8_4_;
  auVar207._8_4_ = auVar72._8_4_ * fVar225;
  fVar226 = auVar65._12_4_;
  auVar207._12_4_ = auVar72._12_4_ * fVar226;
  auVar72 = vfmsub231ps_fma(auVar207,auVar64,auVar69);
  auVar69 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar72 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar208._0_4_ = auVar72._0_4_ * fVar131;
  auVar208._4_4_ = auVar72._4_4_ * fVar216;
  auVar208._8_4_ = auVar72._8_4_ * fVar225;
  auVar208._12_4_ = auVar72._12_4_ * fVar226;
  auVar64 = vfmsub231ps_fma(auVar208,auVar64,auVar75);
  auVar75 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar64 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar137 = auVar64._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar137;
  auVar72 = vrsqrt14ss_avx512f(auVar80,auVar209);
  auVar66 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
  fVar138 = auVar72._0_4_;
  fVar139 = auVar66._0_4_ - auVar67._0_4_ * fVar138 * fVar138 * fVar138;
  auVar72 = vdpps_avx(auVar5,auVar73,0x7f);
  fVar241 = fVar139 * auVar5._0_4_;
  fVar246 = fVar139 * auVar5._4_4_;
  fVar247 = fVar139 * auVar5._8_4_;
  fVar248 = fVar139 * auVar5._12_4_;
  auVar197._0_4_ = fVar137 * auVar73._0_4_;
  auVar197._4_4_ = fVar137 * auVar73._4_4_;
  auVar197._8_4_ = fVar137 * auVar73._8_4_;
  auVar197._12_4_ = fVar137 * auVar73._12_4_;
  fVar137 = auVar72._0_4_;
  auVar83._0_4_ = fVar137 * auVar5._0_4_;
  auVar83._4_4_ = fVar137 * auVar5._4_4_;
  auVar83._8_4_ = fVar137 * auVar5._8_4_;
  auVar83._12_4_ = fVar137 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar197,auVar83);
  auVar72 = vrcp14ss_avx512f(auVar80,auVar209);
  auVar64 = vfnmadd213ss_avx512f(auVar64,auVar72,ZEXT416(0x40000000));
  fVar137 = auVar72._0_4_ * auVar64._0_4_;
  auVar64 = vdpps_avx(auVar69,auVar69,0x7f);
  fVar138 = auVar64._0_4_;
  auVar198._4_12_ = ZEXT812(0) << 0x20;
  auVar198._0_4_ = fVar138;
  auVar72 = vrsqrt14ss_avx512f(auVar80,auVar198);
  auVar73 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
  fVar151 = auVar72._0_4_;
  fVar151 = auVar73._0_4_ - auVar66._0_4_ * fVar151 * fVar151 * fVar151;
  auVar72 = vdpps_avx(auVar69,auVar75,0x7f);
  fVar227 = fVar151 * auVar69._0_4_;
  fVar238 = fVar151 * auVar69._4_4_;
  fVar239 = fVar151 * auVar69._8_4_;
  fVar240 = fVar151 * auVar69._12_4_;
  auVar85._0_4_ = fVar138 * auVar75._0_4_;
  auVar85._4_4_ = fVar138 * auVar75._4_4_;
  auVar85._8_4_ = fVar138 * auVar75._8_4_;
  auVar85._12_4_ = fVar138 * auVar75._12_4_;
  fVar138 = auVar72._0_4_;
  auVar84._0_4_ = fVar138 * auVar69._0_4_;
  auVar84._4_4_ = fVar138 * auVar69._4_4_;
  auVar84._8_4_ = fVar138 * auVar69._8_4_;
  auVar84._12_4_ = fVar138 * auVar69._12_4_;
  auVar73 = vsubps_avx(auVar85,auVar84);
  auVar72 = vrcp14ss_avx512f(auVar80,auVar198);
  auVar64 = vfnmadd213ss_avx512f(auVar64,auVar72,ZEXT416(0x40000000));
  fVar138 = auVar64._0_4_ * auVar72._0_4_;
  auVar64 = vshufps_avx(auVar81,auVar81,0xff);
  auVar91._0_4_ = fVar241 * auVar64._0_4_;
  auVar91._4_4_ = fVar246 * auVar64._4_4_;
  auVar91._8_4_ = fVar247 * auVar64._8_4_;
  auVar91._12_4_ = fVar248 * auVar64._12_4_;
  local_530 = vsubps_avx(auVar81,auVar91);
  auVar72 = vshufps_avx(auVar70,auVar70,0xff);
  auVar88._0_4_ = auVar72._0_4_ * fVar241 + auVar64._0_4_ * fVar139 * fVar137 * auVar5._0_4_;
  auVar88._4_4_ = auVar72._4_4_ * fVar246 + auVar64._4_4_ * fVar139 * fVar137 * auVar5._4_4_;
  auVar88._8_4_ = auVar72._8_4_ * fVar247 + auVar64._8_4_ * fVar139 * fVar137 * auVar5._8_4_;
  auVar88._12_4_ = auVar72._12_4_ * fVar248 + auVar64._12_4_ * fVar139 * fVar137 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar70,auVar88);
  local_540._0_4_ = auVar91._0_4_ + auVar81._0_4_;
  local_540._4_4_ = auVar91._4_4_ + auVar81._4_4_;
  fStack_538 = auVar91._8_4_ + auVar81._8_4_;
  fStack_534 = auVar91._12_4_ + auVar81._12_4_;
  auVar67._0_4_ = fVar140 + auVar88._0_4_;
  auVar67._4_4_ = fVar143 + auVar88._4_4_;
  auVar67._8_4_ = fVar144 + auVar88._8_4_;
  auVar67._12_4_ = fVar145 + auVar88._12_4_;
  auVar64 = vshufps_avx(auVar76,auVar76,0xff);
  auVar86._0_4_ = fVar227 * auVar64._0_4_;
  auVar86._4_4_ = fVar238 * auVar64._4_4_;
  auVar86._8_4_ = fVar239 * auVar64._8_4_;
  auVar86._12_4_ = fVar240 * auVar64._12_4_;
  local_550 = vsubps_avx(auVar76,auVar86);
  auVar72 = vshufps_avx(auVar65,auVar65,0xff);
  auVar80._0_4_ = auVar72._0_4_ * fVar227 + auVar64._0_4_ * fVar151 * auVar73._0_4_ * fVar138;
  auVar80._4_4_ = auVar72._4_4_ * fVar238 + auVar64._4_4_ * fVar151 * auVar73._4_4_ * fVar138;
  auVar80._8_4_ = auVar72._8_4_ * fVar239 + auVar64._8_4_ * fVar151 * auVar73._8_4_ * fVar138;
  auVar80._12_4_ = auVar72._12_4_ * fVar240 + auVar64._12_4_ * fVar151 * auVar73._12_4_ * fVar138;
  auVar64 = vsubps_avx(auVar65,auVar80);
  _local_560 = vaddps_avx512vl(auVar76,auVar86);
  auVar77._0_4_ = fVar131 + auVar80._0_4_;
  auVar77._4_4_ = fVar216 + auVar80._4_4_;
  auVar77._8_4_ = fVar225 + auVar80._8_4_;
  auVar77._12_4_ = fVar226 + auVar80._12_4_;
  auVar72 = vmulps_avx512vl(auVar5,auVar78);
  local_570 = vaddps_avx512vl(local_530,auVar72);
  auVar64 = vmulps_avx512vl(auVar64,auVar78);
  local_580 = vsubps_avx512vl(local_550,auVar64);
  auVar64 = vmulps_avx512vl(auVar67,auVar78);
  _local_590 = vaddps_avx512vl(_local_540,auVar64);
  auVar64 = vmulps_avx512vl(auVar77,auVar78);
  _local_5a0 = vsubps_avx512vl(_local_560,auVar64);
  local_4b0 = vsubps_avx(local_530,auVar74);
  uVar141 = local_4b0._0_4_;
  auVar78._4_4_ = uVar141;
  auVar78._0_4_ = uVar141;
  auVar78._8_4_ = uVar141;
  auVar78._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar72 = vshufps_avx(local_4b0,local_4b0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar131 = pre->ray_space[k].vz.field_0.m128[0];
  fVar216 = pre->ray_space[k].vz.field_0.m128[1];
  fVar225 = pre->ray_space[k].vz.field_0.m128[2];
  fVar226 = pre->ray_space[k].vz.field_0.m128[3];
  auVar68._0_4_ = fVar131 * auVar72._0_4_;
  auVar68._4_4_ = fVar216 * auVar72._4_4_;
  auVar68._8_4_ = fVar225 * auVar72._8_4_;
  auVar68._12_4_ = fVar226 * auVar72._12_4_;
  auVar64 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar4,auVar64);
  auVar75 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar78);
  local_4c0 = vsubps_avx512vl(local_570,auVar74);
  uVar141 = local_4c0._0_4_;
  auVar90._4_4_ = uVar141;
  auVar90._0_4_ = uVar141;
  auVar90._8_4_ = uVar141;
  auVar90._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar72 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar79._0_4_ = fVar131 * auVar72._0_4_;
  auVar79._4_4_ = fVar216 * auVar72._4_4_;
  auVar79._8_4_ = fVar225 * auVar72._8_4_;
  auVar79._12_4_ = fVar226 * auVar72._12_4_;
  auVar64 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar64);
  auVar76 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar90);
  local_4d0 = vsubps_avx512vl(local_580,auVar74);
  uVar141 = local_4d0._0_4_;
  auVar87._4_4_ = uVar141;
  auVar87._0_4_ = uVar141;
  auVar87._8_4_ = uVar141;
  auVar87._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar72 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar94._0_4_ = fVar131 * auVar72._0_4_;
  auVar94._4_4_ = fVar216 * auVar72._4_4_;
  auVar94._8_4_ = fVar225 * auVar72._8_4_;
  auVar94._12_4_ = fVar226 * auVar72._12_4_;
  auVar64 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar64);
  auVar65 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar87);
  local_4e0 = vsubps_avx(local_550,auVar74);
  uVar141 = local_4e0._0_4_;
  auVar92._4_4_ = uVar141;
  auVar92._0_4_ = uVar141;
  auVar92._8_4_ = uVar141;
  auVar92._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar72 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar93._0_4_ = fVar131 * auVar72._0_4_;
  auVar93._4_4_ = fVar216 * auVar72._4_4_;
  auVar93._8_4_ = fVar225 * auVar72._8_4_;
  auVar93._12_4_ = fVar226 * auVar72._12_4_;
  auVar64 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar64);
  auVar66 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar92);
  local_4f0 = vsubps_avx(_local_540,auVar74);
  uVar141 = local_4f0._0_4_;
  auVar185._4_4_ = uVar141;
  auVar185._0_4_ = uVar141;
  auVar185._8_4_ = uVar141;
  auVar185._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar72 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar210._0_4_ = auVar72._0_4_ * fVar131;
  auVar210._4_4_ = auVar72._4_4_ * fVar216;
  auVar210._8_4_ = auVar72._8_4_ * fVar225;
  auVar210._12_4_ = auVar72._12_4_ * fVar226;
  auVar64 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar4,auVar64);
  auVar67 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar185);
  local_500 = vsubps_avx512vl(_local_590,auVar74);
  uVar141 = local_500._0_4_;
  auVar186._4_4_ = uVar141;
  auVar186._0_4_ = uVar141;
  auVar186._8_4_ = uVar141;
  auVar186._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_500,local_500,0x55);
  auVar72 = vshufps_avx(local_500,local_500,0xaa);
  auVar217._0_4_ = auVar72._0_4_ * fVar131;
  auVar217._4_4_ = auVar72._4_4_ * fVar216;
  auVar217._8_4_ = auVar72._8_4_ * fVar225;
  auVar217._12_4_ = auVar72._12_4_ * fVar226;
  auVar64 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar4,auVar64);
  auVar68 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar186);
  local_510 = vsubps_avx512vl(_local_5a0,auVar74);
  uVar141 = local_510._0_4_;
  auVar187._4_4_ = uVar141;
  auVar187._0_4_ = uVar141;
  auVar187._8_4_ = uVar141;
  auVar187._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_510,local_510,0x55);
  auVar72 = vshufps_avx(local_510,local_510,0xaa);
  auVar229._0_4_ = auVar72._0_4_ * fVar131;
  auVar229._4_4_ = auVar72._4_4_ * fVar216;
  auVar229._8_4_ = auVar72._8_4_ * fVar225;
  auVar229._12_4_ = auVar72._12_4_ * fVar226;
  auVar64 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar4,auVar64);
  auVar70 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar187);
  local_520 = vsubps_avx512vl(_local_560,auVar74);
  uVar141 = local_520._0_4_;
  auVar71._4_4_ = uVar141;
  auVar71._0_4_ = uVar141;
  auVar71._8_4_ = uVar141;
  auVar71._12_4_ = uVar141;
  auVar64 = vshufps_avx(local_520,local_520,0x55);
  auVar72 = vshufps_avx(local_520,local_520,0xaa);
  auVar89._0_4_ = auVar72._0_4_ * fVar131;
  auVar89._4_4_ = auVar72._4_4_ * fVar216;
  auVar89._8_4_ = auVar72._8_4_ * fVar225;
  auVar89._12_4_ = auVar72._12_4_ * fVar226;
  auVar64 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar64);
  auVar71 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar71);
  auVar5 = vmovlhps_avx(auVar75,auVar67);
  auVar73 = vmovlhps_avx(auVar76,auVar68);
  auVar69 = vmovlhps_avx512f(auVar65,auVar70);
  _local_490 = vmovlhps_avx512f(auVar66,auVar71);
  auVar72 = vminps_avx(auVar5,auVar73);
  auVar64 = vmaxps_avx(auVar5,auVar73);
  auVar74 = vminps_avx512vl(auVar69,_local_490);
  auVar72 = vminps_avx(auVar72,auVar74);
  auVar74 = vmaxps_avx512vl(auVar69,_local_490);
  auVar64 = vmaxps_avx(auVar64,auVar74);
  auVar74 = vshufpd_avx(auVar72,auVar72,3);
  auVar72 = vminps_avx(auVar72,auVar74);
  auVar74 = vshufpd_avx(auVar64,auVar64,3);
  auVar64 = vmaxps_avx(auVar64,auVar74);
  auVar72 = vandps_avx512vl(auVar72,auVar259._0_16_);
  auVar64 = vandps_avx512vl(auVar64,auVar259._0_16_);
  auVar64 = vmaxps_avx(auVar72,auVar64);
  auVar72 = vmovshdup_avx(auVar64);
  auVar64 = vmaxss_avx(auVar72,auVar64);
  local_628 = (uint)uVar59 + 0xff;
  auVar74 = vmovddup_avx512vl(auVar75);
  auVar75 = vmovddup_avx512vl(auVar76);
  auVar76 = vmovddup_avx512vl(auVar65);
  auVar65 = vmovddup_avx512vl(auVar66);
  local_4a0 = ZEXT416((uint)(auVar64._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4a0);
  auVar64 = vxorps_avx512vl(local_440._0_16_,auVar260._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar64);
  uVar54 = 0;
  auVar64 = vsubps_avx(auVar73,auVar5);
  local_470 = vsubps_avx512vl(auVar69,auVar73);
  local_480 = vsubps_avx512vl(_local_490,auVar69);
  local_5b0 = vsubps_avx(_local_540,local_530);
  local_5c0 = vsubps_avx512vl(_local_590,local_570);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  _local_5e0 = vsubps_avx512vl(_local_560,local_550);
  auVar136 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar136);
  auVar136 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar136);
  auVar72 = ZEXT816(0x3f80000000000000);
  auVar128._32_32_ = auVar136._32_32_;
  auVar66 = auVar72;
LAB_01a33f61:
  do {
    auVar266 = ZEXT3264(local_440);
    auVar265 = ZEXT1664(auVar65);
    auVar81 = vshufps_avx(auVar66,auVar66,0x50);
    auVar249._8_4_ = 0x3f800000;
    auVar249._0_8_ = 0x3f8000003f800000;
    auVar249._12_4_ = 0x3f800000;
    auVar252._16_4_ = 0x3f800000;
    auVar252._0_16_ = auVar249;
    auVar252._20_4_ = 0x3f800000;
    auVar252._24_4_ = 0x3f800000;
    auVar252._28_4_ = 0x3f800000;
    auVar80 = vsubps_avx(auVar249,auVar81);
    fVar131 = auVar81._0_4_;
    fVar137 = auVar67._0_4_;
    auVar159._0_4_ = fVar137 * fVar131;
    fVar216 = auVar81._4_4_;
    fVar138 = auVar67._4_4_;
    auVar159._4_4_ = fVar138 * fVar216;
    fVar225 = auVar81._8_4_;
    auVar159._8_4_ = fVar137 * fVar225;
    fVar226 = auVar81._12_4_;
    auVar159._12_4_ = fVar138 * fVar226;
    fVar139 = auVar68._0_4_;
    auVar164._0_4_ = fVar139 * fVar131;
    fVar151 = auVar68._4_4_;
    auVar164._4_4_ = fVar151 * fVar216;
    auVar164._8_4_ = fVar139 * fVar225;
    auVar164._12_4_ = fVar151 * fVar226;
    fVar140 = auVar70._0_4_;
    auVar173._0_4_ = fVar140 * fVar131;
    fVar143 = auVar70._4_4_;
    auVar173._4_4_ = fVar143 * fVar216;
    auVar173._8_4_ = fVar140 * fVar225;
    auVar173._12_4_ = fVar143 * fVar226;
    fVar144 = auVar71._0_4_;
    auVar146._0_4_ = fVar144 * fVar131;
    fVar145 = auVar71._4_4_;
    auVar146._4_4_ = fVar145 * fVar216;
    auVar146._8_4_ = fVar144 * fVar225;
    auVar146._12_4_ = fVar145 * fVar226;
    auVar77 = vfmadd231ps_avx512vl(auVar159,auVar80,auVar74);
    auVar78 = vfmadd231ps_avx512vl(auVar164,auVar80,auVar75);
    auVar79 = vfmadd231ps_avx512vl(auVar173,auVar80,auVar76);
    auVar80 = vfmadd231ps_avx512vl(auVar146,auVar65,auVar80);
    auVar81 = vmovshdup_avx(auVar72);
    fVar216 = auVar72._0_4_;
    fVar131 = (auVar81._0_4_ - fVar216) * 0.04761905;
    auVar195._4_4_ = fVar216;
    auVar195._0_4_ = fVar216;
    auVar195._8_4_ = fVar216;
    auVar195._12_4_ = fVar216;
    auVar195._16_4_ = fVar216;
    auVar195._20_4_ = fVar216;
    auVar195._24_4_ = fVar216;
    auVar195._28_4_ = fVar216;
    auVar157._0_8_ = auVar81._0_8_;
    auVar157._8_8_ = auVar157._0_8_;
    auVar157._16_8_ = auVar157._0_8_;
    auVar157._24_8_ = auVar157._0_8_;
    auVar101 = vsubps_avx(auVar157,auVar195);
    uVar141 = auVar77._0_4_;
    auVar158._4_4_ = uVar141;
    auVar158._0_4_ = uVar141;
    auVar158._8_4_ = uVar141;
    auVar158._12_4_ = uVar141;
    auVar158._16_4_ = uVar141;
    auVar158._20_4_ = uVar141;
    auVar158._24_4_ = uVar141;
    auVar158._28_4_ = uVar141;
    auVar213._8_4_ = 1;
    auVar213._0_8_ = 0x100000001;
    auVar213._12_4_ = 1;
    auVar213._16_4_ = 1;
    auVar213._20_4_ = 1;
    auVar213._24_4_ = 1;
    auVar213._28_4_ = 1;
    auVar111 = ZEXT1632(auVar77);
    auVar99 = vpermps_avx2(auVar213,auVar111);
    auVar100 = vbroadcastss_avx512vl(auVar78);
    auVar112 = ZEXT1632(auVar78);
    auVar102 = vpermps_avx512vl(auVar213,auVar112);
    auVar103 = vbroadcastss_avx512vl(auVar79);
    auVar109 = ZEXT1632(auVar79);
    auVar104 = vpermps_avx512vl(auVar213,auVar109);
    auVar105 = vbroadcastss_avx512vl(auVar80);
    auVar108 = ZEXT1632(auVar80);
    auVar106 = vpermps_avx512vl(auVar213,auVar108);
    auVar214._4_4_ = fVar131;
    auVar214._0_4_ = fVar131;
    auVar214._8_4_ = fVar131;
    auVar214._12_4_ = fVar131;
    auVar214._16_4_ = fVar131;
    auVar214._20_4_ = fVar131;
    auVar214._24_4_ = fVar131;
    auVar214._28_4_ = fVar131;
    auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar98 = vpermps_avx512vl(auVar97,auVar111);
    auVar184._8_4_ = 3;
    auVar184._0_8_ = 0x300000003;
    auVar184._12_4_ = 3;
    auVar184._16_4_ = 3;
    auVar184._20_4_ = 3;
    auVar184._24_4_ = 3;
    auVar184._28_4_ = 3;
    auVar107 = vpermps_avx512vl(auVar184,auVar111);
    auVar95 = vpermps_avx512vl(auVar97,auVar112);
    auVar111 = vpermps_avx2(auVar184,auVar112);
    auVar96 = vpermps_avx512vl(auVar97,auVar109);
    auVar112 = vpermps_avx2(auVar184,auVar109);
    auVar97 = vpermps_avx512vl(auVar97,auVar108);
    auVar108 = vpermps_avx512vl(auVar184,auVar108);
    auVar81 = vfmadd132ps_fma(auVar101,auVar195,_DAT_01f7b040);
    auVar101 = vsubps_avx(auVar252,ZEXT1632(auVar81));
    auVar109 = vmulps_avx512vl(auVar100,ZEXT1632(auVar81));
    auVar113 = ZEXT1632(auVar81);
    auVar110 = vmulps_avx512vl(auVar102,auVar113);
    auVar80 = vfmadd231ps_fma(auVar109,auVar101,auVar158);
    auVar77 = vfmadd231ps_fma(auVar110,auVar101,auVar99);
    auVar109 = vmulps_avx512vl(auVar103,auVar113);
    auVar110 = vmulps_avx512vl(auVar104,auVar113);
    auVar100 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar100);
    auVar102 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar102);
    auVar109 = vmulps_avx512vl(auVar105,auVar113);
    auVar110 = ZEXT1632(auVar81);
    auVar106 = vmulps_avx512vl(auVar106,auVar110);
    auVar103 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar104);
    fVar225 = auVar81._0_4_;
    fVar226 = auVar81._4_4_;
    auVar30._4_4_ = fVar226 * auVar100._4_4_;
    auVar30._0_4_ = fVar225 * auVar100._0_4_;
    fVar227 = auVar81._8_4_;
    auVar30._8_4_ = fVar227 * auVar100._8_4_;
    fVar238 = auVar81._12_4_;
    auVar30._12_4_ = fVar238 * auVar100._12_4_;
    auVar30._16_4_ = auVar100._16_4_ * 0.0;
    auVar30._20_4_ = auVar100._20_4_ * 0.0;
    auVar30._24_4_ = auVar100._24_4_ * 0.0;
    auVar30._28_4_ = fVar216;
    auVar31._4_4_ = fVar226 * auVar102._4_4_;
    auVar31._0_4_ = fVar225 * auVar102._0_4_;
    auVar31._8_4_ = fVar227 * auVar102._8_4_;
    auVar31._12_4_ = fVar238 * auVar102._12_4_;
    auVar31._16_4_ = auVar102._16_4_ * 0.0;
    auVar31._20_4_ = auVar102._20_4_ * 0.0;
    auVar31._24_4_ = auVar102._24_4_ * 0.0;
    auVar31._28_4_ = auVar99._28_4_;
    auVar80 = vfmadd231ps_fma(auVar30,auVar101,ZEXT1632(auVar80));
    auVar77 = vfmadd231ps_fma(auVar31,auVar101,ZEXT1632(auVar77));
    auVar149._0_4_ = fVar225 * auVar103._0_4_;
    auVar149._4_4_ = fVar226 * auVar103._4_4_;
    auVar149._8_4_ = fVar227 * auVar103._8_4_;
    auVar149._12_4_ = fVar238 * auVar103._12_4_;
    auVar149._16_4_ = auVar103._16_4_ * 0.0;
    auVar149._20_4_ = auVar103._20_4_ * 0.0;
    auVar149._24_4_ = auVar103._24_4_ * 0.0;
    auVar149._28_4_ = 0;
    auVar32._4_4_ = fVar226 * auVar104._4_4_;
    auVar32._0_4_ = fVar225 * auVar104._0_4_;
    auVar32._8_4_ = fVar227 * auVar104._8_4_;
    auVar32._12_4_ = fVar238 * auVar104._12_4_;
    auVar32._16_4_ = auVar104._16_4_ * 0.0;
    auVar32._20_4_ = auVar104._20_4_ * 0.0;
    auVar32._24_4_ = auVar104._24_4_ * 0.0;
    auVar32._28_4_ = auVar103._28_4_;
    auVar78 = vfmadd231ps_fma(auVar149,auVar101,auVar100);
    auVar79 = vfmadd231ps_fma(auVar32,auVar101,auVar102);
    auVar33._28_4_ = auVar102._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar238 * auVar79._12_4_,
                            CONCAT48(fVar227 * auVar79._8_4_,
                                     CONCAT44(fVar226 * auVar79._4_4_,fVar225 * auVar79._0_4_))));
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar238 * auVar78._12_4_,
                                                 CONCAT48(fVar227 * auVar78._8_4_,
                                                          CONCAT44(fVar226 * auVar78._4_4_,
                                                                   fVar225 * auVar78._0_4_)))),
                              auVar101,ZEXT1632(auVar80));
    auVar94 = vfmadd231ps_fma(auVar33,auVar101,ZEXT1632(auVar77));
    auVar99 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar80));
    auVar100 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar77));
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar99 = vmulps_avx512vl(auVar99,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar102);
    auVar206._0_4_ = fVar131 * auVar99._0_4_;
    auVar206._4_4_ = fVar131 * auVar99._4_4_;
    auVar206._8_4_ = fVar131 * auVar99._8_4_;
    auVar206._12_4_ = fVar131 * auVar99._12_4_;
    auVar206._16_4_ = fVar131 * auVar99._16_4_;
    auVar206._20_4_ = fVar131 * auVar99._20_4_;
    auVar206._24_4_ = fVar131 * auVar99._24_4_;
    auVar206._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar214,auVar100);
    auVar77 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
    auVar100 = vpermt2ps_avx512vl(ZEXT1632(auVar90),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar103 = vpermt2ps_avx512vl(ZEXT1632(auVar94),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar150._0_4_ = auVar206._0_4_ + auVar90._0_4_;
    auVar150._4_4_ = auVar206._4_4_ + auVar90._4_4_;
    auVar150._8_4_ = auVar206._8_4_ + auVar90._8_4_;
    auVar150._12_4_ = auVar206._12_4_ + auVar90._12_4_;
    auVar150._16_4_ = auVar206._16_4_ + 0.0;
    auVar150._20_4_ = auVar206._20_4_ + 0.0;
    auVar150._24_4_ = auVar206._24_4_ + 0.0;
    auVar150._28_4_ = 0;
    auVar113 = ZEXT1632(auVar77);
    auVar104 = vpermt2ps_avx512vl(auVar206,_DAT_01fb9fc0,auVar113);
    auVar105 = vaddps_avx512vl(ZEXT1632(auVar94),auVar99);
    auVar106 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar113);
    auVar99 = vsubps_avx(auVar100,auVar104);
    auVar104 = vsubps_avx512vl(auVar103,auVar106);
    auVar106 = vmulps_avx512vl(auVar95,auVar110);
    auVar109 = vmulps_avx512vl(auVar111,auVar110);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar107);
    auVar107 = vmulps_avx512vl(auVar96,auVar110);
    auVar109 = vmulps_avx512vl(auVar112,auVar110);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,auVar95);
    auVar111 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar111);
    auVar97 = vmulps_avx512vl(auVar97,auVar110);
    auVar95 = vmulps_avx512vl(auVar108,auVar110);
    auVar80 = vfmadd231ps_fma(auVar97,auVar101,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar112);
    auVar95 = vmulps_avx512vl(auVar110,auVar107);
    auVar108 = ZEXT1632(auVar81);
    auVar96 = vmulps_avx512vl(auVar108,auVar111);
    auVar106 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar106);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar98);
    auVar97 = vmulps_avx512vl(auVar108,auVar97);
    auVar107 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar238 * auVar80._12_4_,
                                             CONCAT48(fVar227 * auVar80._8_4_,
                                                      CONCAT44(fVar226 * auVar80._4_4_,
                                                               fVar225 * auVar80._0_4_)))),auVar101,
                          auVar107);
    auVar111 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar111);
    auVar34._4_4_ = fVar226 * auVar107._4_4_;
    auVar34._0_4_ = fVar225 * auVar107._0_4_;
    auVar34._8_4_ = fVar227 * auVar107._8_4_;
    auVar34._12_4_ = fVar238 * auVar107._12_4_;
    auVar34._16_4_ = auVar107._16_4_ * 0.0;
    auVar34._20_4_ = auVar107._20_4_ * 0.0;
    auVar34._24_4_ = auVar107._24_4_ * 0.0;
    auVar34._28_4_ = auVar112._28_4_;
    auVar112 = vmulps_avx512vl(auVar108,auVar111);
    auVar97 = vfmadd231ps_avx512vl(auVar34,auVar101,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar98,auVar101);
    auVar101 = vsubps_avx512vl(auVar107,auVar106);
    auVar111 = vsubps_avx512vl(auVar111,auVar98);
    auVar101 = vmulps_avx512vl(auVar101,auVar102);
    auVar111 = vmulps_avx512vl(auVar111,auVar102);
    fVar216 = fVar131 * auVar101._0_4_;
    fVar225 = fVar131 * auVar101._4_4_;
    auVar35._4_4_ = fVar225;
    auVar35._0_4_ = fVar216;
    fVar226 = fVar131 * auVar101._8_4_;
    auVar35._8_4_ = fVar226;
    fVar227 = fVar131 * auVar101._12_4_;
    auVar35._12_4_ = fVar227;
    fVar238 = fVar131 * auVar101._16_4_;
    auVar35._16_4_ = fVar238;
    fVar239 = fVar131 * auVar101._20_4_;
    auVar35._20_4_ = fVar239;
    fVar131 = fVar131 * auVar101._24_4_;
    auVar35._24_4_ = fVar131;
    auVar35._28_4_ = auVar101._28_4_;
    auVar111 = vmulps_avx512vl(auVar214,auVar111);
    auVar102 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar113);
    auVar106 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,auVar113);
    auVar215._0_4_ = auVar97._0_4_ + fVar216;
    auVar215._4_4_ = auVar97._4_4_ + fVar225;
    auVar215._8_4_ = auVar97._8_4_ + fVar226;
    auVar215._12_4_ = auVar97._12_4_ + fVar227;
    auVar215._16_4_ = auVar97._16_4_ + fVar238;
    auVar215._20_4_ = auVar97._20_4_ + fVar239;
    auVar215._24_4_ = auVar97._24_4_ + fVar131;
    auVar215._28_4_ = auVar97._28_4_ + auVar101._28_4_;
    auVar101 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar98 = vaddps_avx512vl(auVar112,auVar111);
    auVar111 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar101 = vsubps_avx(auVar102,auVar101);
    auVar111 = vsubps_avx512vl(auVar106,auVar111);
    auVar162 = ZEXT1632(auVar90);
    auVar107 = vsubps_avx512vl(auVar97,auVar162);
    auVar170 = ZEXT1632(auVar94);
    auVar95 = vsubps_avx512vl(auVar112,auVar170);
    auVar96 = vsubps_avx512vl(auVar102,auVar100);
    auVar107 = vaddps_avx512vl(auVar107,auVar96);
    auVar96 = vsubps_avx512vl(auVar106,auVar103);
    auVar95 = vaddps_avx512vl(auVar95,auVar96);
    auVar96 = vmulps_avx512vl(auVar170,auVar107);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar162,auVar95);
    auVar108 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar150,auVar95);
    auVar109 = vmulps_avx512vl(auVar104,auVar107);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar99,auVar95);
    auVar110 = vmulps_avx512vl(auVar103,auVar107);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar100,auVar95);
    auVar113 = vmulps_avx512vl(auVar112,auVar107);
    auVar113 = vfnmadd231ps_avx512vl(auVar113,auVar97,auVar95);
    auVar114 = vmulps_avx512vl(auVar98,auVar107);
    auVar114 = vfnmadd231ps_avx512vl(auVar114,auVar215,auVar95);
    auVar115 = vmulps_avx512vl(auVar111,auVar107);
    auVar115 = vfnmadd231ps_avx512vl(auVar115,auVar101,auVar95);
    auVar107 = vmulps_avx512vl(auVar106,auVar107);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar102,auVar95);
    auVar95 = vminps_avx512vl(auVar96,auVar108);
    auVar96 = vmaxps_avx512vl(auVar96,auVar108);
    auVar108 = vminps_avx512vl(auVar109,auVar110);
    auVar95 = vminps_avx512vl(auVar95,auVar108);
    auVar108 = vmaxps_avx512vl(auVar109,auVar110);
    auVar96 = vmaxps_avx512vl(auVar96,auVar108);
    auVar108 = vminps_avx512vl(auVar113,auVar114);
    auVar109 = vmaxps_avx512vl(auVar113,auVar114);
    auVar110 = vminps_avx512vl(auVar115,auVar107);
    auVar108 = vminps_avx512vl(auVar108,auVar110);
    auVar95 = vminps_avx512vl(auVar95,auVar108);
    auVar107 = vmaxps_avx512vl(auVar115,auVar107);
    auVar107 = vmaxps_avx512vl(auVar109,auVar107);
    auVar107 = vmaxps_avx512vl(auVar96,auVar107);
    uVar24 = vcmpps_avx512vl(auVar95,local_440,2);
    uVar25 = vcmpps_avx512vl(auVar107,local_460,5);
    bVar52 = (byte)uVar24 & (byte)uVar25 & 0x7f;
    if (bVar52 != 0) {
      auVar107 = vsubps_avx512vl(auVar100,auVar162);
      auVar95 = vsubps_avx512vl(auVar103,auVar170);
      auVar96 = vsubps_avx512vl(auVar102,auVar97);
      auVar107 = vaddps_avx512vl(auVar107,auVar96);
      auVar96 = vsubps_avx512vl(auVar106,auVar112);
      auVar95 = vaddps_avx512vl(auVar95,auVar96);
      auVar96 = vmulps_avx512vl(auVar170,auVar107);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar95,auVar162);
      auVar105 = vmulps_avx512vl(auVar105,auVar107);
      auVar105 = vfnmadd213ps_avx512vl(auVar150,auVar95,auVar105);
      auVar104 = vmulps_avx512vl(auVar104,auVar107);
      auVar104 = vfnmadd213ps_avx512vl(auVar99,auVar95,auVar104);
      auVar99 = vmulps_avx512vl(auVar103,auVar107);
      auVar103 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar100);
      auVar99 = vmulps_avx512vl(auVar112,auVar107);
      auVar112 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar97);
      auVar99 = vmulps_avx512vl(auVar98,auVar107);
      auVar97 = vfnmadd213ps_avx512vl(auVar215,auVar95,auVar99);
      auVar99 = vmulps_avx512vl(auVar111,auVar107);
      auVar98 = vfnmadd213ps_avx512vl(auVar101,auVar95,auVar99);
      auVar101 = vmulps_avx512vl(auVar106,auVar107);
      auVar102 = vfnmadd231ps_avx512vl(auVar101,auVar102,auVar95);
      auVar99 = vminps_avx(auVar96,auVar105);
      auVar101 = vmaxps_avx(auVar96,auVar105);
      auVar100 = vminps_avx(auVar104,auVar103);
      auVar100 = vminps_avx(auVar99,auVar100);
      auVar99 = vmaxps_avx(auVar104,auVar103);
      auVar101 = vmaxps_avx(auVar101,auVar99);
      auVar111 = vminps_avx(auVar112,auVar97);
      auVar99 = vmaxps_avx(auVar112,auVar97);
      auVar112 = vminps_avx(auVar98,auVar102);
      auVar111 = vminps_avx(auVar111,auVar112);
      auVar111 = vminps_avx(auVar100,auVar111);
      auVar100 = vmaxps_avx(auVar98,auVar102);
      auVar99 = vmaxps_avx(auVar99,auVar100);
      auVar101 = vmaxps_avx(auVar101,auVar99);
      uVar24 = vcmpps_avx512vl(auVar101,local_460,5);
      uVar25 = vcmpps_avx512vl(auVar111,local_440,2);
      bVar52 = bVar52 & (byte)uVar24 & (byte)uVar25;
      if (bVar52 != 0) {
        auStack_5f0[uVar54] = (uint)bVar52;
        uVar24 = vmovlps_avx(auVar72);
        (&uStack_420)[uVar54] = uVar24;
        uVar2 = vmovlps_avx(auVar66);
        auStack_3a0[uVar54] = uVar2;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar136 = ZEXT1664(auVar72);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar259 = ZEXT1664(auVar72);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar260 = ZEXT1664(auVar72);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar261 = ZEXT3264(auVar101);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar262 = ZEXT1664(auVar72);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar263 = ZEXT1664(auVar72);
    auVar129._32_32_ = auVar128._32_32_;
    auVar129._0_32_ = _DAT_01fb9fe0;
    auVar264 = ZEXT3264(_DAT_01fb9fe0);
    auVar130._16_48_ = auVar129._16_48_;
    auVar130._0_16_ = auVar64;
LAB_01a34462:
    do {
      do {
        do {
          if ((int)uVar54 == 0) {
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar29._4_4_ = uVar141;
            auVar29._0_4_ = uVar141;
            auVar29._8_4_ = uVar141;
            auVar29._12_4_ = uVar141;
            auVar29._16_4_ = uVar141;
            auVar29._20_4_ = uVar141;
            auVar29._24_4_ = uVar141;
            auVar29._28_4_ = uVar141;
            uVar24 = vcmpps_avx512vl(local_3c0,auVar29,2);
            uVar59 = (ulong)((uint)uVar59 & local_628 & (uint)uVar24);
            goto LAB_01a33861;
          }
          uVar53 = (int)uVar54 - 1;
          uVar55 = (ulong)uVar53;
          uVar8 = auStack_5f0[uVar55];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = auStack_3a0[uVar55];
          uVar2 = 0;
          for (uVar58 = (ulong)uVar8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000)
          {
            uVar2 = uVar2 + 1;
          }
          uVar57 = uVar8 - 1 & uVar8;
          bVar62 = uVar57 == 0;
          auStack_5f0[uVar55] = uVar57;
          if (bVar62) {
            uVar54 = (ulong)uVar53;
          }
          auVar132._8_8_ = 0;
          auVar132._0_8_ = uVar2;
          auVar72 = vpunpcklqdq_avx(auVar132,ZEXT416((int)uVar2 + 1));
          auVar128._32_32_ = auVar130._32_32_;
          auVar72 = vcvtqq2ps_avx512vl(auVar72);
          auVar72 = vmulps_avx512vl(auVar72,auVar262._0_16_);
          uVar141 = *(undefined4 *)((long)&uStack_420 + uVar55 * 8 + 4);
          auVar26._4_4_ = uVar141;
          auVar26._0_4_ = uVar141;
          auVar26._8_4_ = uVar141;
          auVar26._12_4_ = uVar141;
          auVar81 = vmulps_avx512vl(auVar72,auVar26);
          auVar80 = auVar263._0_16_;
          auVar72 = vsubps_avx512vl(auVar80,auVar72);
          uVar141 = *(undefined4 *)(&uStack_420 + uVar55);
          auVar27._4_4_ = uVar141;
          auVar27._0_4_ = uVar141;
          auVar27._8_4_ = uVar141;
          auVar27._12_4_ = uVar141;
          auVar72 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar27);
          auVar81 = vmovshdup_avx(auVar72);
          fVar131 = auVar81._0_4_ - auVar72._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar131));
          if (uVar8 == 0 || bVar62) goto LAB_01a33f61;
          auVar81 = vshufps_avx(auVar66,auVar66,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar131));
          auVar79 = vsubps_avx512vl(auVar80,auVar81);
          fVar216 = auVar81._0_4_;
          auVar165._0_4_ = fVar216 * fVar137;
          fVar225 = auVar81._4_4_;
          auVar165._4_4_ = fVar225 * fVar138;
          fVar226 = auVar81._8_4_;
          auVar165._8_4_ = fVar226 * fVar137;
          fVar227 = auVar81._12_4_;
          auVar165._12_4_ = fVar227 * fVar138;
          auVar174._0_4_ = fVar216 * fVar139;
          auVar174._4_4_ = fVar225 * fVar151;
          auVar174._8_4_ = fVar226 * fVar139;
          auVar174._12_4_ = fVar227 * fVar151;
          auVar180._0_4_ = fVar216 * fVar140;
          auVar180._4_4_ = fVar225 * fVar143;
          auVar180._8_4_ = fVar226 * fVar140;
          auVar180._12_4_ = fVar227 * fVar143;
          auVar152._0_4_ = fVar216 * fVar144;
          auVar152._4_4_ = fVar225 * fVar145;
          auVar152._8_4_ = fVar226 * fVar144;
          auVar152._12_4_ = fVar227 * fVar145;
          auVar81 = vfmadd231ps_fma(auVar165,auVar79,auVar74);
          auVar77 = vfmadd231ps_fma(auVar174,auVar79,auVar75);
          auVar78 = vfmadd231ps_fma(auVar180,auVar79,auVar76);
          auVar79 = vfmadd231ps_fma(auVar152,auVar79,auVar65);
          auVar163._16_16_ = auVar81;
          auVar163._0_16_ = auVar81;
          auVar171._16_16_ = auVar77;
          auVar171._0_16_ = auVar77;
          auVar179._16_16_ = auVar78;
          auVar179._0_16_ = auVar78;
          auVar99 = vpermps_avx512vl(auVar264._0_32_,ZEXT1632(auVar72));
          auVar101 = vsubps_avx(auVar171,auVar163);
          auVar77 = vfmadd213ps_fma(auVar101,auVar99,auVar163);
          auVar101 = vsubps_avx(auVar179,auVar171);
          auVar90 = vfmadd213ps_fma(auVar101,auVar99,auVar171);
          auVar81 = vsubps_avx(auVar79,auVar78);
          auVar172._16_16_ = auVar81;
          auVar172._0_16_ = auVar81;
          auVar81 = vfmadd213ps_fma(auVar172,auVar99,auVar179);
          auVar101 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar77));
          auVar77 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar77));
          auVar101 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar90));
          auVar81 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar90));
          auVar101 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar77));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar101,auVar99);
          auVar128._0_32_ = vmulps_avx512vl(auVar101,auVar261._0_32_);
          fVar216 = fVar131 * 0.33333334;
          auVar181._0_8_ =
               CONCAT44(auVar93._4_4_ + fVar216 * auVar128._4_4_,
                        auVar93._0_4_ + fVar216 * auVar128._0_4_);
          auVar181._8_4_ = auVar93._8_4_ + fVar216 * auVar128._8_4_;
          auVar181._12_4_ = auVar93._12_4_ + fVar216 * auVar128._12_4_;
          auVar166._0_4_ = fVar216 * auVar128._16_4_;
          auVar166._4_4_ = fVar216 * auVar128._20_4_;
          auVar166._8_4_ = fVar216 * auVar128._24_4_;
          auVar166._12_4_ = fVar216 * auVar128._28_4_;
          auVar88 = vsubps_avx((undefined1  [16])0x0,auVar166);
          auVar90 = vshufpd_avx(auVar93,auVar93,3);
          auVar94 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar81 = vsubps_avx(auVar90,auVar93);
          auVar77 = vsubps_avx(auVar94,(undefined1  [16])0x0);
          auVar199._0_4_ = auVar81._0_4_ + auVar77._0_4_;
          auVar199._4_4_ = auVar81._4_4_ + auVar77._4_4_;
          auVar199._8_4_ = auVar81._8_4_ + auVar77._8_4_;
          auVar199._12_4_ = auVar81._12_4_ + auVar77._12_4_;
          auVar81 = vshufps_avx(auVar93,auVar93,0xb1);
          auVar77 = vshufps_avx(auVar181,auVar181,0xb1);
          auVar78 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar250._4_4_ = auVar199._0_4_;
          auVar250._0_4_ = auVar199._0_4_;
          auVar250._8_4_ = auVar199._0_4_;
          auVar250._12_4_ = auVar199._0_4_;
          auVar84 = vshufps_avx(auVar199,auVar199,0x55);
          fVar216 = auVar84._0_4_;
          auVar211._0_4_ = auVar81._0_4_ * fVar216;
          fVar225 = auVar84._4_4_;
          auVar211._4_4_ = auVar81._4_4_ * fVar225;
          fVar226 = auVar84._8_4_;
          auVar211._8_4_ = auVar81._8_4_ * fVar226;
          fVar227 = auVar84._12_4_;
          auVar211._12_4_ = auVar81._12_4_ * fVar227;
          auVar218._0_4_ = auVar77._0_4_ * fVar216;
          auVar218._4_4_ = auVar77._4_4_ * fVar225;
          auVar218._8_4_ = auVar77._8_4_ * fVar226;
          auVar218._12_4_ = auVar77._12_4_ * fVar227;
          auVar230._0_4_ = auVar78._0_4_ * fVar216;
          auVar230._4_4_ = auVar78._4_4_ * fVar225;
          auVar230._8_4_ = auVar78._8_4_ * fVar226;
          auVar230._12_4_ = auVar78._12_4_ * fVar227;
          auVar200._0_4_ = auVar79._0_4_ * fVar216;
          auVar200._4_4_ = auVar79._4_4_ * fVar225;
          auVar200._8_4_ = auVar79._8_4_ * fVar226;
          auVar200._12_4_ = auVar79._12_4_ * fVar227;
          auVar81 = vfmadd231ps_fma(auVar211,auVar250,auVar93);
          auVar77 = vfmadd231ps_fma(auVar218,auVar250,auVar181);
          auVar86 = vfmadd231ps_fma(auVar230,auVar250,auVar88);
          auVar87 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar250);
          auVar84 = vshufpd_avx(auVar81,auVar81,1);
          auVar85 = vshufpd_avx(auVar77,auVar77,1);
          auVar130._16_48_ = auVar128._16_48_;
          auVar82 = vshufpd_avx512vl(auVar86,auVar86,1);
          auVar83 = vshufpd_avx512vl(auVar87,auVar87,1);
          auVar78 = vminss_avx(auVar81,auVar77);
          auVar81 = vmaxss_avx(auVar77,auVar81);
          auVar79 = vminss_avx(auVar86,auVar87);
          auVar77 = vmaxss_avx(auVar87,auVar86);
          auVar78 = vminss_avx(auVar78,auVar79);
          auVar81 = vmaxss_avx(auVar77,auVar81);
          auVar79 = vminss_avx(auVar84,auVar85);
          auVar77 = vmaxss_avx(auVar85,auVar84);
          auVar84 = vminss_avx512f(auVar82,auVar83);
          auVar85 = vmaxss_avx512f(auVar83,auVar82);
          auVar77 = vmaxss_avx(auVar85,auVar77);
          auVar130._0_16_ = vminss_avx512f(auVar79,auVar84);
          fVar225 = auVar77._0_4_;
          fVar216 = auVar81._0_4_;
          if (auVar78._0_4_ < 0.0001) {
            bVar63 = fVar225 == -0.0001;
            bVar60 = NAN(fVar225);
            if (fVar225 <= -0.0001) goto LAB_01a34694;
            break;
          }
LAB_01a34694:
          vucomiss_avx512f(auVar130._0_16_);
          bVar63 = fVar225 <= -0.0001;
          bVar61 = -0.0001 < fVar216;
          bVar60 = bVar63;
          if (!bVar63) break;
          uVar24 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar25 = vcmpps_avx512vl(auVar130._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar53 = (uint)uVar24 & (uint)uVar25;
          bVar13 = (uVar53 & 1) == 0;
          bVar63 = bVar61 && bVar13;
          bVar60 = bVar61 && (uVar53 & 1) == 0;
        } while (!bVar61 || !bVar13);
        auVar85 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
        auVar266 = ZEXT1664(auVar85);
        vcmpss_avx512f(auVar78,auVar85,1);
        uVar24 = vcmpss_avx512f(auVar81,auVar85,1);
        bVar61 = (bool)((byte)uVar24 & 1);
        auVar117._16_48_ = auVar130._16_48_;
        auVar117._0_16_ = auVar267._0_16_;
        auVar116._4_60_ = auVar117._4_60_;
        auVar116._0_4_ = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * auVar267._0_4_);
        vucomiss_avx512f(auVar116._0_16_);
        bVar60 = (bool)(!bVar63 | bVar60);
        bVar61 = bVar60 == false;
        auVar119._16_48_ = auVar130._16_48_;
        auVar119._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar118._4_60_ = auVar119._4_60_;
        auVar118._0_4_ = (uint)bVar60 * auVar85._0_4_ + (uint)!bVar60 * 0x7f800000;
        auVar84 = auVar118._0_16_;
        auVar121._16_48_ = auVar130._16_48_;
        auVar121._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar120._4_60_ = auVar121._4_60_;
        auVar120._0_4_ = (uint)bVar60 * auVar85._0_4_ + (uint)!bVar60 * -0x800000;
        auVar79 = auVar120._0_16_;
        auVar86 = vxorps_avx512vl(auVar265._0_16_,auVar265._0_16_);
        auVar265 = ZEXT1664(auVar86);
        uVar24 = vcmpss_avx512f(auVar130._0_16_,auVar85,1);
        bVar63 = (bool)((byte)uVar24 & 1);
        auVar123._16_48_ = auVar130._16_48_;
        auVar123._0_16_ = auVar267._0_16_;
        auVar122._4_60_ = auVar123._4_60_;
        auVar122._0_4_ = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * auVar267._0_4_);
        vucomiss_avx512f(auVar122._0_16_);
        if ((bVar60) || (bVar61)) {
          auVar85 = vucomiss_avx512f(auVar78);
          if ((bVar60) || (bVar61)) {
            auVar87 = vxorps_avx512vl(auVar78,auVar260._0_16_);
            auVar78 = vsubss_avx512f(auVar85,auVar78);
            auVar78 = vdivss_avx512f(auVar87,auVar78);
            auVar85 = vsubss_avx512f(ZEXT416(0x3f800000),auVar78);
            auVar85 = vfmadd213ss_avx512f(auVar85,auVar86,auVar78);
            auVar78 = auVar85;
          }
          else {
            auVar78 = vxorps_avx512vl(auVar85,auVar85);
            vucomiss_avx512f(auVar78);
            auVar85 = ZEXT416(0x3f800000);
            if ((bVar60) || (bVar61)) {
              auVar85 = SUB6416(ZEXT464(0xff800000),0);
              auVar78 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar84 = vminss_avx512f(auVar84,auVar78);
          auVar79 = vmaxss_avx(auVar85,auVar79);
        }
        auVar267 = ZEXT464(0x3f800000);
        uVar24 = vcmpss_avx512f(auVar77,auVar86,1);
        bVar63 = (bool)((byte)uVar24 & 1);
        auVar77 = auVar267._0_16_;
        fVar226 = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * 0x3f800000);
        if ((auVar116._0_4_ != fVar226) || (NAN(auVar116._0_4_) || NAN(fVar226))) {
          if ((fVar225 != fVar216) || (NAN(fVar225) || NAN(fVar216))) {
            auVar81 = vxorps_avx512vl(auVar81,auVar260._0_16_);
            auVar201._0_4_ = auVar81._0_4_ / (fVar225 - fVar216);
            auVar201._4_12_ = auVar81._4_12_;
            auVar81 = vsubss_avx512f(auVar77,auVar201);
            auVar81 = vfmadd213ss_avx512f(auVar81,auVar86,auVar201);
            auVar78 = auVar81;
          }
          else if ((fVar216 != 0.0) ||
                  (auVar81 = auVar77, auVar78 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar216))) {
            auVar81 = SUB6416(ZEXT464(0xff800000),0);
            auVar78 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar84 = vminss_avx(auVar84,auVar78);
          auVar79 = vmaxss_avx(auVar81,auVar79);
        }
        bVar63 = auVar122._0_4_ != fVar226;
        auVar81 = vminss_avx512f(auVar84,auVar77);
        auVar125._16_48_ = auVar130._16_48_;
        auVar125._0_16_ = auVar84;
        auVar124._4_60_ = auVar125._4_60_;
        auVar124._0_4_ = (uint)bVar63 * auVar81._0_4_ + (uint)!bVar63 * auVar84._0_4_;
        auVar81 = vmaxss_avx512f(auVar77,auVar79);
        auVar127._16_48_ = auVar130._16_48_;
        auVar127._0_16_ = auVar79;
        auVar126._4_60_ = auVar127._4_60_;
        auVar126._0_4_ = (uint)bVar63 * auVar81._0_4_ + (uint)!bVar63 * auVar79._0_4_;
        auVar81 = vmaxss_avx512f(auVar86,auVar124._0_16_);
        auVar130._0_16_ = vminss_avx512f(auVar126._0_16_,auVar77);
      } while (auVar130._0_4_ < auVar81._0_4_);
      auVar87 = vmaxss_avx512f(auVar86,ZEXT416((uint)(auVar81._0_4_ + -0.1)));
      auVar83 = vminss_avx512f(ZEXT416((uint)(auVar130._0_4_ + 0.1)),auVar77);
      auVar153._0_8_ = auVar93._0_8_;
      auVar153._8_8_ = auVar153._0_8_;
      auVar219._8_8_ = auVar181._0_8_;
      auVar219._0_8_ = auVar181._0_8_;
      auVar231._8_8_ = auVar88._0_8_;
      auVar231._0_8_ = auVar88._0_8_;
      auVar81 = vshufpd_avx(auVar181,auVar181,3);
      auVar78 = vshufpd_avx(auVar88,auVar88,3);
      auVar79 = vshufps_avx(auVar87,auVar83,0);
      auVar85 = vsubps_avx512vl(auVar80,auVar79);
      fVar216 = auVar79._0_4_;
      auVar175._0_4_ = fVar216 * auVar90._0_4_;
      fVar225 = auVar79._4_4_;
      auVar175._4_4_ = fVar225 * auVar90._4_4_;
      fVar226 = auVar79._8_4_;
      auVar175._8_4_ = fVar226 * auVar90._8_4_;
      fVar227 = auVar79._12_4_;
      auVar175._12_4_ = fVar227 * auVar90._12_4_;
      auVar182._0_4_ = fVar216 * auVar81._0_4_;
      auVar182._4_4_ = fVar225 * auVar81._4_4_;
      auVar182._8_4_ = fVar226 * auVar81._8_4_;
      auVar182._12_4_ = fVar227 * auVar81._12_4_;
      auVar253._0_4_ = auVar78._0_4_ * fVar216;
      auVar253._4_4_ = auVar78._4_4_ * fVar225;
      auVar253._8_4_ = auVar78._8_4_ * fVar226;
      auVar253._12_4_ = auVar78._12_4_ * fVar227;
      auVar167._0_4_ = fVar216 * auVar94._0_4_;
      auVar167._4_4_ = fVar225 * auVar94._4_4_;
      auVar167._8_4_ = fVar226 * auVar94._8_4_;
      auVar167._12_4_ = fVar227 * auVar94._12_4_;
      auVar90 = vfmadd231ps_fma(auVar175,auVar85,auVar153);
      auVar94 = vfmadd231ps_fma(auVar182,auVar85,auVar219);
      auVar84 = vfmadd231ps_fma(auVar253,auVar85,auVar231);
      auVar85 = vfmadd231ps_fma(auVar167,auVar85,ZEXT816(0));
      auVar78 = vsubss_avx512f(auVar77,auVar87);
      auVar81 = vmovshdup_avx(auVar66);
      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar87._0_4_)),auVar66,auVar78);
      auVar78 = vsubss_avx512f(auVar77,auVar83);
      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar83._0_4_)),auVar66,auVar78);
      auVar88 = vdivss_avx512f(auVar77,ZEXT416((uint)fVar131));
      auVar66 = vsubps_avx(auVar94,auVar90);
      auVar185 = auVar136._0_16_;
      auVar78 = vmulps_avx512vl(auVar66,auVar185);
      auVar66 = vsubps_avx(auVar84,auVar94);
      auVar79 = vmulps_avx512vl(auVar66,auVar185);
      auVar66 = vsubps_avx(auVar85,auVar84);
      auVar66 = vmulps_avx512vl(auVar66,auVar185);
      auVar81 = vminps_avx(auVar79,auVar66);
      auVar66 = vmaxps_avx(auVar79,auVar66);
      auVar81 = vminps_avx(auVar78,auVar81);
      auVar66 = vmaxps_avx(auVar78,auVar66);
      auVar78 = vshufpd_avx(auVar81,auVar81,3);
      auVar79 = vshufpd_avx(auVar66,auVar66,3);
      auVar81 = vminps_avx(auVar81,auVar78);
      auVar66 = vmaxps_avx(auVar66,auVar79);
      fVar131 = auVar88._0_4_;
      auVar202._0_4_ = auVar81._0_4_ * fVar131;
      auVar202._4_4_ = auVar81._4_4_ * fVar131;
      auVar202._8_4_ = auVar81._8_4_ * fVar131;
      auVar202._12_4_ = auVar81._12_4_ * fVar131;
      auVar188._0_4_ = fVar131 * auVar66._0_4_;
      auVar188._4_4_ = fVar131 * auVar66._4_4_;
      auVar188._8_4_ = fVar131 * auVar66._8_4_;
      auVar188._12_4_ = fVar131 * auVar66._12_4_;
      auVar88 = vdivss_avx512f(auVar77,ZEXT416((uint)(auVar83._0_4_ - auVar82._0_4_)));
      auVar66 = vshufpd_avx(auVar90,auVar90,3);
      auVar81 = vshufpd_avx(auVar94,auVar94,3);
      auVar78 = vshufpd_avx(auVar84,auVar84,3);
      auVar79 = vshufpd_avx(auVar85,auVar85,3);
      auVar66 = vsubps_avx(auVar66,auVar90);
      auVar90 = vsubps_avx(auVar81,auVar94);
      auVar94 = vsubps_avx(auVar78,auVar84);
      auVar79 = vsubps_avx(auVar79,auVar85);
      auVar81 = vminps_avx(auVar66,auVar90);
      auVar66 = vmaxps_avx(auVar66,auVar90);
      auVar78 = vminps_avx(auVar94,auVar79);
      auVar78 = vminps_avx(auVar81,auVar78);
      auVar81 = vmaxps_avx(auVar94,auVar79);
      auVar66 = vmaxps_avx(auVar66,auVar81);
      fVar131 = auVar88._0_4_;
      auVar232._0_4_ = fVar131 * auVar78._0_4_;
      auVar232._4_4_ = fVar131 * auVar78._4_4_;
      auVar232._8_4_ = fVar131 * auVar78._8_4_;
      auVar232._12_4_ = fVar131 * auVar78._12_4_;
      auVar220._0_4_ = fVar131 * auVar66._0_4_;
      auVar220._4_4_ = fVar131 * auVar66._4_4_;
      auVar220._8_4_ = fVar131 * auVar66._8_4_;
      auVar220._12_4_ = fVar131 * auVar66._12_4_;
      auVar79 = vinsertps_avx(auVar72,auVar82,0x10);
      auVar89 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9f90,auVar83);
      auVar142._0_4_ = auVar79._0_4_ + auVar89._0_4_;
      auVar142._4_4_ = auVar79._4_4_ + auVar89._4_4_;
      auVar142._8_4_ = auVar79._8_4_ + auVar89._8_4_;
      auVar142._12_4_ = auVar79._12_4_ + auVar89._12_4_;
      auVar28._8_4_ = 0x3f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar88 = vmulps_avx512vl(auVar142,auVar28);
      auVar81 = vshufps_avx(auVar88,auVar88,0x54);
      uVar141 = auVar88._0_4_;
      auVar147._4_4_ = uVar141;
      auVar147._0_4_ = uVar141;
      auVar147._8_4_ = uVar141;
      auVar147._12_4_ = uVar141;
      auVar78 = vfmadd213ps_fma(auVar64,auVar147,auVar5);
      auVar90 = vfmadd213ps_fma(local_470,auVar147,auVar73);
      auVar94 = vfmadd213ps_fma(local_480,auVar147,auVar69);
      auVar66 = vsubps_avx(auVar90,auVar78);
      auVar78 = vfmadd213ps_fma(auVar66,auVar147,auVar78);
      auVar66 = vsubps_avx(auVar94,auVar90);
      auVar66 = vfmadd213ps_fma(auVar66,auVar147,auVar90);
      auVar66 = vsubps_avx(auVar66,auVar78);
      auVar78 = vfmadd231ps_fma(auVar78,auVar66,auVar147);
      auVar84 = vmulps_avx512vl(auVar66,auVar185);
      auVar243._8_8_ = auVar78._0_8_;
      auVar243._0_8_ = auVar78._0_8_;
      auVar66 = vshufpd_avx(auVar78,auVar78,3);
      auVar78 = vshufps_avx(auVar88,auVar88,0x55);
      auVar90 = vsubps_avx(auVar66,auVar243);
      auVar94 = vfmadd231ps_fma(auVar243,auVar78,auVar90);
      auVar254._8_8_ = auVar84._0_8_;
      auVar254._0_8_ = auVar84._0_8_;
      auVar66 = vshufpd_avx(auVar84,auVar84,3);
      auVar66 = vsubps_avx512vl(auVar66,auVar254);
      auVar66 = vfmadd213ps_avx512vl(auVar66,auVar78,auVar254);
      auVar148._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
      auVar148._8_4_ = auVar90._8_4_ ^ 0x80000000;
      auVar148._12_4_ = auVar90._12_4_ ^ 0x80000000;
      auVar78 = vmovshdup_avx512vl(auVar66);
      auVar255._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      auVar255._8_4_ = auVar78._8_4_ ^ 0x80000000;
      auVar255._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar84 = vmovshdup_avx512vl(auVar90);
      auVar85 = vpermt2ps_avx512vl(auVar255,ZEXT416(5),auVar90);
      auVar266 = ZEXT464(0x40400000);
      auVar78 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar78._0_4_ * auVar90._0_4_)),auVar66,auVar84);
      auVar90 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar148);
      auVar168._0_4_ = auVar78._0_4_;
      auVar168._4_4_ = auVar168._0_4_;
      auVar168._8_4_ = auVar168._0_4_;
      auVar168._12_4_ = auVar168._0_4_;
      auVar66 = vdivps_avx(auVar85,auVar168);
      auVar91 = vdivps_avx512vl(auVar90,auVar168);
      fVar131 = auVar94._0_4_;
      auVar78 = vshufps_avx(auVar94,auVar94,0x55);
      auVar244._0_4_ = fVar131 * auVar66._0_4_ + auVar78._0_4_ * auVar91._0_4_;
      auVar244._4_4_ = fVar131 * auVar66._4_4_ + auVar78._4_4_ * auVar91._4_4_;
      auVar244._8_4_ = fVar131 * auVar66._8_4_ + auVar78._8_4_ * auVar91._8_4_;
      auVar244._12_4_ = fVar131 * auVar66._12_4_ + auVar78._12_4_ * auVar91._12_4_;
      auVar87 = vsubps_avx(auVar81,auVar244);
      auVar78 = vmovshdup_avx(auVar66);
      auVar81 = vinsertps_avx(auVar202,auVar232,0x1c);
      auVar256._0_4_ = auVar78._0_4_ * auVar81._0_4_;
      auVar256._4_4_ = auVar78._4_4_ * auVar81._4_4_;
      auVar256._8_4_ = auVar78._8_4_ * auVar81._8_4_;
      auVar256._12_4_ = auVar78._12_4_ * auVar81._12_4_;
      auVar93 = vinsertps_avx512f(auVar188,auVar220,0x1c);
      auVar78 = vmulps_avx512vl(auVar78,auVar93);
      auVar85 = vminps_avx512vl(auVar256,auVar78);
      auVar94 = vmaxps_avx(auVar78,auVar256);
      auVar84 = vmovshdup_avx(auVar91);
      auVar78 = vinsertps_avx(auVar232,auVar202,0x4c);
      auVar233._0_4_ = auVar84._0_4_ * auVar78._0_4_;
      auVar233._4_4_ = auVar84._4_4_ * auVar78._4_4_;
      auVar233._8_4_ = auVar84._8_4_ * auVar78._8_4_;
      auVar233._12_4_ = auVar84._12_4_ * auVar78._12_4_;
      auVar90 = vinsertps_avx(auVar220,auVar188,0x4c);
      auVar221._0_4_ = auVar84._0_4_ * auVar90._0_4_;
      auVar221._4_4_ = auVar84._4_4_ * auVar90._4_4_;
      auVar221._8_4_ = auVar84._8_4_ * auVar90._8_4_;
      auVar221._12_4_ = auVar84._12_4_ * auVar90._12_4_;
      auVar84 = vminps_avx(auVar233,auVar221);
      auVar85 = vaddps_avx512vl(auVar85,auVar84);
      auVar84 = vmaxps_avx(auVar221,auVar233);
      auVar222._0_4_ = auVar94._0_4_ + auVar84._0_4_;
      auVar222._4_4_ = auVar94._4_4_ + auVar84._4_4_;
      auVar222._8_4_ = auVar94._8_4_ + auVar84._8_4_;
      auVar222._12_4_ = auVar94._12_4_ + auVar84._12_4_;
      auVar234._8_8_ = 0x3f80000000000000;
      auVar234._0_8_ = 0x3f80000000000000;
      auVar94 = vsubps_avx(auVar234,auVar222);
      auVar84 = vsubps_avx(auVar234,auVar85);
      auVar85 = vsubps_avx(auVar79,auVar88);
      auVar88 = vsubps_avx(auVar89,auVar88);
      fVar227 = auVar85._0_4_;
      auVar257._0_4_ = fVar227 * auVar94._0_4_;
      fVar238 = auVar85._4_4_;
      auVar257._4_4_ = fVar238 * auVar94._4_4_;
      fVar239 = auVar85._8_4_;
      auVar257._8_4_ = fVar239 * auVar94._8_4_;
      fVar240 = auVar85._12_4_;
      auVar257._12_4_ = fVar240 * auVar94._12_4_;
      auVar92 = vbroadcastss_avx512vl(auVar66);
      auVar81 = vmulps_avx512vl(auVar92,auVar81);
      auVar93 = vmulps_avx512vl(auVar92,auVar93);
      auVar92 = vminps_avx512vl(auVar81,auVar93);
      auVar93 = vmaxps_avx512vl(auVar93,auVar81);
      auVar81 = vbroadcastss_avx512vl(auVar91);
      auVar78 = vmulps_avx512vl(auVar81,auVar78);
      auVar81 = vmulps_avx512vl(auVar81,auVar90);
      auVar90 = vminps_avx512vl(auVar78,auVar81);
      auVar90 = vaddps_avx512vl(auVar92,auVar90);
      auVar85 = vmulps_avx512vl(auVar85,auVar84);
      fVar131 = auVar88._0_4_;
      auVar223._0_4_ = fVar131 * auVar94._0_4_;
      fVar216 = auVar88._4_4_;
      auVar223._4_4_ = fVar216 * auVar94._4_4_;
      fVar225 = auVar88._8_4_;
      auVar223._8_4_ = fVar225 * auVar94._8_4_;
      fVar226 = auVar88._12_4_;
      auVar223._12_4_ = fVar226 * auVar94._12_4_;
      auVar235._0_4_ = fVar131 * auVar84._0_4_;
      auVar235._4_4_ = fVar216 * auVar84._4_4_;
      auVar235._8_4_ = fVar225 * auVar84._8_4_;
      auVar235._12_4_ = fVar226 * auVar84._12_4_;
      auVar81 = vmaxps_avx(auVar81,auVar78);
      auVar189._0_4_ = auVar93._0_4_ + auVar81._0_4_;
      auVar189._4_4_ = auVar93._4_4_ + auVar81._4_4_;
      auVar189._8_4_ = auVar93._8_4_ + auVar81._8_4_;
      auVar189._12_4_ = auVar93._12_4_ + auVar81._12_4_;
      auVar203._8_8_ = 0x3f800000;
      auVar203._0_8_ = 0x3f800000;
      auVar81 = vsubps_avx(auVar203,auVar189);
      auVar78 = vsubps_avx512vl(auVar203,auVar90);
      auVar251._0_4_ = fVar227 * auVar81._0_4_;
      auVar251._4_4_ = fVar238 * auVar81._4_4_;
      auVar251._8_4_ = fVar239 * auVar81._8_4_;
      auVar251._12_4_ = fVar240 * auVar81._12_4_;
      auVar245._0_4_ = fVar227 * auVar78._0_4_;
      auVar245._4_4_ = fVar238 * auVar78._4_4_;
      auVar245._8_4_ = fVar239 * auVar78._8_4_;
      auVar245._12_4_ = fVar240 * auVar78._12_4_;
      auVar190._0_4_ = fVar131 * auVar81._0_4_;
      auVar190._4_4_ = fVar216 * auVar81._4_4_;
      auVar190._8_4_ = fVar225 * auVar81._8_4_;
      auVar190._12_4_ = fVar226 * auVar81._12_4_;
      auVar204._0_4_ = fVar131 * auVar78._0_4_;
      auVar204._4_4_ = fVar216 * auVar78._4_4_;
      auVar204._8_4_ = fVar225 * auVar78._8_4_;
      auVar204._12_4_ = fVar226 * auVar78._12_4_;
      auVar81 = vminps_avx(auVar251,auVar245);
      auVar78 = vminps_avx512vl(auVar190,auVar204);
      auVar90 = vminps_avx512vl(auVar81,auVar78);
      auVar81 = vmaxps_avx(auVar245,auVar251);
      auVar78 = vmaxps_avx(auVar204,auVar190);
      auVar78 = vmaxps_avx(auVar78,auVar81);
      auVar94 = vminps_avx512vl(auVar257,auVar85);
      auVar81 = vminps_avx(auVar223,auVar235);
      auVar81 = vminps_avx(auVar94,auVar81);
      auVar81 = vhaddps_avx(auVar90,auVar81);
      auVar130._0_16_ = vmaxps_avx512vl(auVar85,auVar257);
      auVar90 = vmaxps_avx(auVar235,auVar223);
      auVar90 = vmaxps_avx(auVar90,auVar130._0_16_);
      auVar78 = vhaddps_avx(auVar78,auVar90);
      auVar81 = vshufps_avx(auVar81,auVar81,0xe8);
      auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
      auVar191._0_4_ = auVar81._0_4_ + auVar87._0_4_;
      auVar191._4_4_ = auVar81._4_4_ + auVar87._4_4_;
      auVar191._8_4_ = auVar81._8_4_ + auVar87._8_4_;
      auVar191._12_4_ = auVar81._12_4_ + auVar87._12_4_;
      auVar205._0_4_ = auVar78._0_4_ + auVar87._0_4_;
      auVar205._4_4_ = auVar78._4_4_ + auVar87._4_4_;
      auVar205._8_4_ = auVar78._8_4_ + auVar87._8_4_;
      auVar205._12_4_ = auVar78._12_4_ + auVar87._12_4_;
      auVar81 = vmaxps_avx(auVar79,auVar191);
      auVar78 = vminps_avx(auVar205,auVar89);
      uVar2 = vcmpps_avx512vl(auVar78,auVar81,1);
    } while ((uVar2 & 3) != 0);
    uVar2 = vcmpps_avx512vl(auVar205,auVar89,1);
    uVar24 = vcmpps_avx512vl(auVar72,auVar191,1);
    if (((ushort)uVar24 & (ushort)uVar2 & 1) == 0) {
      bVar52 = 0;
    }
    else {
      auVar81 = vmovshdup_avx(auVar191);
      bVar52 = auVar82._0_4_ < auVar81._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar54 || uVar8 != 0 && !bVar62) | bVar52) == 1) {
      lVar56 = 0xc9;
      do {
        lVar56 = lVar56 + -1;
        if (lVar56 == 0) goto LAB_01a34462;
        auVar72 = vsubss_avx512f(auVar77,auVar87);
        fVar225 = auVar72._0_4_;
        fVar131 = fVar225 * fVar225 * fVar225;
        auVar72 = vmulss_avx512f(auVar87,ZEXT416(0x40400000));
        fVar216 = auVar72._0_4_ * fVar225 * fVar225;
        fVar226 = auVar87._0_4_;
        auVar72 = vmulss_avx512f(ZEXT416((uint)(fVar226 * fVar226)),ZEXT416(0x40400000));
        fVar225 = fVar225 * auVar72._0_4_;
        auVar160._4_4_ = fVar131;
        auVar160._0_4_ = fVar131;
        auVar160._8_4_ = fVar131;
        auVar160._12_4_ = fVar131;
        auVar154._4_4_ = fVar216;
        auVar154._0_4_ = fVar216;
        auVar154._8_4_ = fVar216;
        auVar154._12_4_ = fVar216;
        auVar133._4_4_ = fVar225;
        auVar133._0_4_ = fVar225;
        auVar133._8_4_ = fVar225;
        auVar133._12_4_ = fVar225;
        fVar226 = fVar226 * fVar226 * fVar226;
        auVar176._0_4_ = (float)local_490._0_4_ * fVar226;
        auVar176._4_4_ = (float)local_490._4_4_ * fVar226;
        auVar176._8_4_ = fStack_488 * fVar226;
        auVar176._12_4_ = fStack_484 * fVar226;
        auVar72 = vfmadd231ps_fma(auVar176,auVar69,auVar133);
        auVar72 = vfmadd231ps_fma(auVar72,auVar73,auVar154);
        auVar72 = vfmadd231ps_fma(auVar72,auVar5,auVar160);
        auVar134._8_8_ = auVar72._0_8_;
        auVar134._0_8_ = auVar72._0_8_;
        auVar72 = vshufpd_avx(auVar72,auVar72,3);
        auVar81 = vshufps_avx(auVar87,auVar87,0x55);
        auVar72 = vsubps_avx(auVar72,auVar134);
        auVar81 = vfmadd213ps_fma(auVar72,auVar81,auVar134);
        fVar131 = auVar81._0_4_;
        auVar72 = vshufps_avx(auVar81,auVar81,0x55);
        auVar135._0_4_ = auVar66._0_4_ * fVar131 + auVar91._0_4_ * auVar72._0_4_;
        auVar135._4_4_ = auVar66._4_4_ * fVar131 + auVar91._4_4_ * auVar72._4_4_;
        auVar135._8_4_ = auVar66._8_4_ * fVar131 + auVar91._8_4_ * auVar72._8_4_;
        auVar135._12_4_ = auVar66._12_4_ * fVar131 + auVar91._12_4_ * auVar72._12_4_;
        auVar87 = vsubps_avx(auVar87,auVar135);
        auVar72 = vandps_avx512vl(auVar81,auVar259._0_16_);
        auVar130._0_16_ = vprolq_avx512vl(auVar72,0x20);
        auVar72 = vmaxss_avx(auVar130._0_16_,auVar72);
        bVar62 = auVar72._0_4_ <= (float)local_4a0._0_4_;
      } while ((float)local_4a0._0_4_ <= auVar72._0_4_);
      auVar72 = vucomiss_avx512f(auVar86);
      if (bVar62) {
        auVar66 = vucomiss_avx512f(auVar72);
        auVar267 = ZEXT1664(auVar66);
        if (bVar62) {
          vmovshdup_avx(auVar72);
          auVar66 = vucomiss_avx512f(auVar86);
          if (bVar62) {
            auVar81 = vucomiss_avx512f(auVar66);
            auVar267 = ZEXT1664(auVar81);
            if (bVar62) {
              auVar77 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar88 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar77 = vdpps_avx(auVar88,local_4b0,0x7f);
              auVar78 = vdpps_avx(auVar88,local_4c0,0x7f);
              auVar79 = vdpps_avx(auVar88,local_4d0,0x7f);
              auVar90 = vdpps_avx(auVar88,local_4e0,0x7f);
              auVar94 = vdpps_avx(auVar88,local_4f0,0x7f);
              auVar84 = vdpps_avx(auVar88,local_500,0x7f);
              auVar85 = vdpps_avx(auVar88,local_510,0x7f);
              auVar88 = vdpps_avx(auVar88,local_520,0x7f);
              auVar86 = vsubss_avx512f(auVar81,auVar66);
              fVar227 = auVar66._0_4_;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar94._0_4_)),auVar86,auVar77);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar227)),auVar86,auVar78);
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ * fVar227)),auVar86,auVar79);
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar88._0_4_)),auVar86,auVar90);
              auVar81 = vsubss_avx512f(auVar81,auVar72);
              auVar183._0_4_ = auVar81._0_4_;
              fVar216 = auVar183._0_4_ * auVar183._0_4_ * auVar183._0_4_;
              auVar81 = vmulss_avx512f(auVar72,ZEXT416(0x40400000));
              fVar225 = auVar81._0_4_ * auVar183._0_4_ * auVar183._0_4_;
              fVar131 = auVar72._0_4_;
              auVar177._0_4_ = fVar131 * fVar131;
              auVar177._4_4_ = auVar72._4_4_ * auVar72._4_4_;
              auVar177._8_4_ = auVar72._8_4_ * auVar72._8_4_;
              auVar177._12_4_ = auVar72._12_4_ * auVar72._12_4_;
              auVar130._0_16_ = vmulss_avx512f(auVar177,ZEXT416(0x40400000));
              fVar226 = auVar183._0_4_ * auVar130._0_4_;
              fVar239 = fVar131 * auVar177._0_4_;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * auVar79._0_4_)),
                                        ZEXT416((uint)fVar226),auVar78);
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar225),auVar77);
              auVar66 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar216),auVar66);
              fVar238 = auVar66._0_4_;
              if ((fVar1 <= fVar238) &&
                 (fVar240 = *(float *)(ray + k * 4 + 0x200), fVar238 <= fVar240)) {
                auVar66 = vshufps_avx(auVar72,auVar72,0x55);
                auVar77 = vsubps_avx512vl(auVar80,auVar66);
                fVar241 = auVar66._0_4_;
                auVar212._0_4_ = fVar241 * (float)local_540._0_4_;
                fVar246 = auVar66._4_4_;
                auVar212._4_4_ = fVar246 * (float)local_540._4_4_;
                fVar247 = auVar66._8_4_;
                auVar212._8_4_ = fVar247 * fStack_538;
                fVar248 = auVar66._12_4_;
                auVar212._12_4_ = fVar248 * fStack_534;
                auVar224._0_4_ = fVar241 * (float)local_590._0_4_;
                auVar224._4_4_ = fVar246 * (float)local_590._4_4_;
                auVar224._8_4_ = fVar247 * fStack_588;
                auVar224._12_4_ = fVar248 * fStack_584;
                auVar236._0_4_ = fVar241 * (float)local_5a0._0_4_;
                auVar236._4_4_ = fVar246 * (float)local_5a0._4_4_;
                auVar236._8_4_ = fVar247 * fStack_598;
                auVar236._12_4_ = fVar248 * fStack_594;
                auVar192._0_4_ = fVar241 * (float)local_560._0_4_;
                auVar192._4_4_ = fVar246 * (float)local_560._4_4_;
                auVar192._8_4_ = fVar247 * fStack_558;
                auVar192._12_4_ = fVar248 * fStack_554;
                auVar66 = vfmadd231ps_fma(auVar212,auVar77,local_530);
                auVar81 = vfmadd231ps_fma(auVar224,auVar77,local_570);
                auVar80 = vfmadd231ps_fma(auVar236,auVar77,local_580);
                auVar77 = vfmadd231ps_fma(auVar192,auVar77,local_550);
                auVar66 = vsubps_avx(auVar81,auVar66);
                auVar81 = vsubps_avx(auVar80,auVar81);
                auVar80 = vsubps_avx(auVar77,auVar80);
                auVar237._0_4_ = fVar131 * auVar81._0_4_;
                auVar237._4_4_ = fVar131 * auVar81._4_4_;
                auVar237._8_4_ = fVar131 * auVar81._8_4_;
                auVar237._12_4_ = fVar131 * auVar81._12_4_;
                auVar183._4_4_ = auVar183._0_4_;
                auVar183._8_4_ = auVar183._0_4_;
                auVar183._12_4_ = auVar183._0_4_;
                auVar66 = vfmadd231ps_fma(auVar237,auVar183,auVar66);
                auVar193._0_4_ = fVar131 * auVar80._0_4_;
                auVar193._4_4_ = fVar131 * auVar80._4_4_;
                auVar193._8_4_ = fVar131 * auVar80._8_4_;
                auVar193._12_4_ = fVar131 * auVar80._12_4_;
                auVar81 = vfmadd231ps_fma(auVar193,auVar183,auVar81);
                auVar194._0_4_ = fVar131 * auVar81._0_4_;
                auVar194._4_4_ = fVar131 * auVar81._4_4_;
                auVar194._8_4_ = fVar131 * auVar81._8_4_;
                auVar194._12_4_ = fVar131 * auVar81._12_4_;
                auVar66 = vfmadd231ps_fma(auVar194,auVar183,auVar66);
                auVar130._0_16_ = vmulps_avx512vl(auVar66,auVar185);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar178._0_4_ = fVar239 * (float)local_5e0._0_4_;
                  auVar178._4_4_ = fVar239 * (float)local_5e0._4_4_;
                  auVar178._8_4_ = fVar239 * fStack_5d8;
                  auVar178._12_4_ = fVar239 * fStack_5d4;
                  auVar169._4_4_ = fVar226;
                  auVar169._0_4_ = fVar226;
                  auVar169._8_4_ = fVar226;
                  auVar169._12_4_ = fVar226;
                  auVar66 = vfmadd132ps_fma(auVar169,auVar178,local_5d0);
                  auVar161._4_4_ = fVar225;
                  auVar161._0_4_ = fVar225;
                  auVar161._8_4_ = fVar225;
                  auVar161._12_4_ = fVar225;
                  auVar66 = vfmadd132ps_fma(auVar161,auVar66,local_5c0);
                  auVar155._4_4_ = fVar216;
                  auVar155._0_4_ = fVar216;
                  auVar155._8_4_ = fVar216;
                  auVar155._12_4_ = fVar216;
                  auVar80 = vfmadd132ps_fma(auVar155,auVar66,local_5b0);
                  auVar66 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar81 = vshufps_avx(auVar130._0_16_,auVar130._0_16_,0xc9);
                  auVar156._0_4_ = auVar80._0_4_ * auVar81._0_4_;
                  auVar156._4_4_ = auVar80._4_4_ * auVar81._4_4_;
                  auVar156._8_4_ = auVar80._8_4_ * auVar81._8_4_;
                  auVar156._12_4_ = auVar80._12_4_ * auVar81._12_4_;
                  auVar66 = vfmsub231ps_fma(auVar156,auVar130._0_16_,auVar66);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar238;
                    uVar141 = vextractps_avx(auVar66,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar141;
                    uVar141 = vextractps_avx(auVar66,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar141;
                    *(int *)(ray + k * 4 + 0x380) = auVar66._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar131;
                    *(float *)(ray + k * 4 + 0x400) = fVar227;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar6;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_01a34462;
                  }
                  local_200 = vbroadcastss_avx512f(auVar72);
                  auVar128 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar128,ZEXT1664(auVar72));
                  auVar128 = vpermps_avx512f(auVar128,ZEXT1664(auVar66));
                  auVar129 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar129,ZEXT1664(auVar66));
                  local_240 = vbroadcastss_avx512f(auVar66);
                  local_2c0[0] = (RTCHitN)auVar128[0];
                  local_2c0[1] = (RTCHitN)auVar128[1];
                  local_2c0[2] = (RTCHitN)auVar128[2];
                  local_2c0[3] = (RTCHitN)auVar128[3];
                  local_2c0[4] = (RTCHitN)auVar128[4];
                  local_2c0[5] = (RTCHitN)auVar128[5];
                  local_2c0[6] = (RTCHitN)auVar128[6];
                  local_2c0[7] = (RTCHitN)auVar128[7];
                  local_2c0[8] = (RTCHitN)auVar128[8];
                  local_2c0[9] = (RTCHitN)auVar128[9];
                  local_2c0[10] = (RTCHitN)auVar128[10];
                  local_2c0[0xb] = (RTCHitN)auVar128[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar128[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar128[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar128[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar128[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar128[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar128[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar128[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar128[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar128[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar128[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar128[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar128[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar128[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar128[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar128[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar128[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar128[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar128[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar128[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar128[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar128[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar128[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar128[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar128[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar128[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar128[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar128[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar128[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar128[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar128[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar128[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar128[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar128[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar128[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar128[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar128[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar128[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar128[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar128[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar128[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar128[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar128[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar128[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar128[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar128[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar128[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar128[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar128[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar128[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar128[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar128[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar128[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar128 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar128);
                  vpcmpeqd_avx2(auVar128._0_32_,auVar128._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar238;
                  auVar130 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar130);
                  local_620.valid = (int *)local_400;
                  local_620.geometryUserPtr = pGVar9->userPtr;
                  local_620.context = context->user;
                  local_620.hit = local_2c0;
                  local_620.N = 0x10;
                  local_620.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_620);
                    auVar267 = ZEXT464(0x3f800000);
                    auVar264 = ZEXT3264(_DAT_01fb9fe0);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar263 = ZEXT1664(auVar72);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar262 = ZEXT1664(auVar72);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar261 = ZEXT3264(auVar101);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar260 = ZEXT1664(auVar72);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar259 = ZEXT1664(auVar72);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar136 = ZEXT1664(auVar72);
                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                    auVar268 = ZEXT1664(auVar72);
                    auVar130 = vmovdqa64_avx512f(local_400);
                  }
                  uVar24 = vptestmd_avx512f(auVar130,auVar130);
                  if ((short)uVar24 != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_620);
                      auVar267 = ZEXT464(0x3f800000);
                      auVar264 = ZEXT3264(_DAT_01fb9fe0);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar263 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar262 = ZEXT1664(auVar72);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar261 = ZEXT3264(auVar101);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar260 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar259 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar136 = ZEXT1664(auVar72);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                      auVar268 = ZEXT1664(auVar72);
                      auVar130 = vmovdqa64_avx512f(local_400);
                    }
                    uVar2 = vptestmd_avx512f(auVar130,auVar130);
                    if ((short)uVar2 != 0) {
                      iVar37 = *(int *)(local_620.hit + 4);
                      iVar38 = *(int *)(local_620.hit + 8);
                      iVar39 = *(int *)(local_620.hit + 0xc);
                      iVar40 = *(int *)(local_620.hit + 0x10);
                      iVar41 = *(int *)(local_620.hit + 0x14);
                      iVar42 = *(int *)(local_620.hit + 0x18);
                      iVar43 = *(int *)(local_620.hit + 0x1c);
                      iVar44 = *(int *)(local_620.hit + 0x20);
                      iVar45 = *(int *)(local_620.hit + 0x24);
                      iVar46 = *(int *)(local_620.hit + 0x28);
                      iVar47 = *(int *)(local_620.hit + 0x2c);
                      iVar48 = *(int *)(local_620.hit + 0x30);
                      iVar49 = *(int *)(local_620.hit + 0x34);
                      iVar50 = *(int *)(local_620.hit + 0x38);
                      iVar51 = *(int *)(local_620.hit + 0x3c);
                      bVar52 = (byte)uVar2;
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar2 >> 7) & 1);
                      bVar16 = (byte)(uVar2 >> 8);
                      bVar17 = (bool)((byte)(uVar2 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar2 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      bVar23 = SUB81(uVar2 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x300) =
                           (uint)(bVar52 & 1) * *(int *)local_620.hit |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x300);
                      *(uint *)(local_620.ray + 0x304) =
                           (uint)bVar62 * iVar37 | (uint)!bVar62 * *(int *)(local_620.ray + 0x304);
                      *(uint *)(local_620.ray + 0x308) =
                           (uint)bVar63 * iVar38 | (uint)!bVar63 * *(int *)(local_620.ray + 0x308);
                      *(uint *)(local_620.ray + 0x30c) =
                           (uint)bVar60 * iVar39 | (uint)!bVar60 * *(int *)(local_620.ray + 0x30c);
                      *(uint *)(local_620.ray + 0x310) =
                           (uint)bVar61 * iVar40 | (uint)!bVar61 * *(int *)(local_620.ray + 0x310);
                      *(uint *)(local_620.ray + 0x314) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x314);
                      *(uint *)(local_620.ray + 0x318) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x318);
                      *(uint *)(local_620.ray + 0x31c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x31c);
                      *(uint *)(local_620.ray + 800) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 800);
                      *(uint *)(local_620.ray + 0x324) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x324);
                      *(uint *)(local_620.ray + 0x328) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x328);
                      *(uint *)(local_620.ray + 0x32c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x32c);
                      *(uint *)(local_620.ray + 0x330) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x330);
                      *(uint *)(local_620.ray + 0x334) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x334);
                      *(uint *)(local_620.ray + 0x338) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x338);
                      *(uint *)(local_620.ray + 0x33c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x33c);
                      iVar37 = *(int *)(local_620.hit + 0x44);
                      iVar38 = *(int *)(local_620.hit + 0x48);
                      iVar39 = *(int *)(local_620.hit + 0x4c);
                      iVar40 = *(int *)(local_620.hit + 0x50);
                      iVar41 = *(int *)(local_620.hit + 0x54);
                      iVar42 = *(int *)(local_620.hit + 0x58);
                      iVar43 = *(int *)(local_620.hit + 0x5c);
                      iVar44 = *(int *)(local_620.hit + 0x60);
                      iVar45 = *(int *)(local_620.hit + 100);
                      iVar46 = *(int *)(local_620.hit + 0x68);
                      iVar47 = *(int *)(local_620.hit + 0x6c);
                      iVar48 = *(int *)(local_620.hit + 0x70);
                      iVar49 = *(int *)(local_620.hit + 0x74);
                      iVar50 = *(int *)(local_620.hit + 0x78);
                      iVar51 = *(int *)(local_620.hit + 0x7c);
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar2 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar2 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar2 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      bVar23 = SUB81(uVar2 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x340) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x40) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x340);
                      *(uint *)(local_620.ray + 0x344) =
                           (uint)bVar62 * iVar37 | (uint)!bVar62 * *(int *)(local_620.ray + 0x344);
                      *(uint *)(local_620.ray + 0x348) =
                           (uint)bVar63 * iVar38 | (uint)!bVar63 * *(int *)(local_620.ray + 0x348);
                      *(uint *)(local_620.ray + 0x34c) =
                           (uint)bVar60 * iVar39 | (uint)!bVar60 * *(int *)(local_620.ray + 0x34c);
                      *(uint *)(local_620.ray + 0x350) =
                           (uint)bVar61 * iVar40 | (uint)!bVar61 * *(int *)(local_620.ray + 0x350);
                      *(uint *)(local_620.ray + 0x354) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x354);
                      *(uint *)(local_620.ray + 0x358) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x358);
                      *(uint *)(local_620.ray + 0x35c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x35c);
                      *(uint *)(local_620.ray + 0x360) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x360);
                      *(uint *)(local_620.ray + 0x364) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x364);
                      *(uint *)(local_620.ray + 0x368) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x368);
                      *(uint *)(local_620.ray + 0x36c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x36c);
                      *(uint *)(local_620.ray + 0x370) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x370);
                      *(uint *)(local_620.ray + 0x374) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x374);
                      *(uint *)(local_620.ray + 0x378) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x378);
                      *(uint *)(local_620.ray + 0x37c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x37c);
                      iVar37 = *(int *)(local_620.hit + 0x84);
                      iVar38 = *(int *)(local_620.hit + 0x88);
                      iVar39 = *(int *)(local_620.hit + 0x8c);
                      iVar40 = *(int *)(local_620.hit + 0x90);
                      iVar41 = *(int *)(local_620.hit + 0x94);
                      iVar42 = *(int *)(local_620.hit + 0x98);
                      iVar43 = *(int *)(local_620.hit + 0x9c);
                      iVar44 = *(int *)(local_620.hit + 0xa0);
                      iVar45 = *(int *)(local_620.hit + 0xa4);
                      iVar46 = *(int *)(local_620.hit + 0xa8);
                      iVar47 = *(int *)(local_620.hit + 0xac);
                      iVar48 = *(int *)(local_620.hit + 0xb0);
                      iVar49 = *(int *)(local_620.hit + 0xb4);
                      iVar50 = *(int *)(local_620.hit + 0xb8);
                      iVar51 = *(int *)(local_620.hit + 0xbc);
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar2 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar2 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar2 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      bVar23 = SUB81(uVar2 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x380) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x80) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x380);
                      *(uint *)(local_620.ray + 900) =
                           (uint)bVar62 * iVar37 | (uint)!bVar62 * *(int *)(local_620.ray + 900);
                      *(uint *)(local_620.ray + 0x388) =
                           (uint)bVar63 * iVar38 | (uint)!bVar63 * *(int *)(local_620.ray + 0x388);
                      *(uint *)(local_620.ray + 0x38c) =
                           (uint)bVar60 * iVar39 | (uint)!bVar60 * *(int *)(local_620.ray + 0x38c);
                      *(uint *)(local_620.ray + 0x390) =
                           (uint)bVar61 * iVar40 | (uint)!bVar61 * *(int *)(local_620.ray + 0x390);
                      *(uint *)(local_620.ray + 0x394) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x394);
                      *(uint *)(local_620.ray + 0x398) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x398);
                      *(uint *)(local_620.ray + 0x39c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x39c);
                      *(uint *)(local_620.ray + 0x3a0) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x3a0);
                      *(uint *)(local_620.ray + 0x3a4) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3a4);
                      *(uint *)(local_620.ray + 0x3a8) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3a8);
                      *(uint *)(local_620.ray + 0x3ac) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3ac);
                      *(uint *)(local_620.ray + 0x3b0) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3b0);
                      *(uint *)(local_620.ray + 0x3b4) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3b4);
                      *(uint *)(local_620.ray + 0x3b8) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3b8);
                      *(uint *)(local_620.ray + 0x3bc) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x3bc);
                      iVar37 = *(int *)(local_620.hit + 0xc4);
                      iVar38 = *(int *)(local_620.hit + 200);
                      iVar39 = *(int *)(local_620.hit + 0xcc);
                      iVar40 = *(int *)(local_620.hit + 0xd0);
                      iVar41 = *(int *)(local_620.hit + 0xd4);
                      iVar42 = *(int *)(local_620.hit + 0xd8);
                      iVar43 = *(int *)(local_620.hit + 0xdc);
                      iVar44 = *(int *)(local_620.hit + 0xe0);
                      iVar45 = *(int *)(local_620.hit + 0xe4);
                      iVar46 = *(int *)(local_620.hit + 0xe8);
                      iVar47 = *(int *)(local_620.hit + 0xec);
                      iVar48 = *(int *)(local_620.hit + 0xf0);
                      iVar49 = *(int *)(local_620.hit + 0xf4);
                      iVar50 = *(int *)(local_620.hit + 0xf8);
                      iVar51 = *(int *)(local_620.hit + 0xfc);
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar2 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar2 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar2 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      bVar23 = SUB81(uVar2 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x3c0) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0xc0) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x3c0);
                      *(uint *)(local_620.ray + 0x3c4) =
                           (uint)bVar62 * iVar37 | (uint)!bVar62 * *(int *)(local_620.ray + 0x3c4);
                      *(uint *)(local_620.ray + 0x3c8) =
                           (uint)bVar63 * iVar38 | (uint)!bVar63 * *(int *)(local_620.ray + 0x3c8);
                      *(uint *)(local_620.ray + 0x3cc) =
                           (uint)bVar60 * iVar39 | (uint)!bVar60 * *(int *)(local_620.ray + 0x3cc);
                      *(uint *)(local_620.ray + 0x3d0) =
                           (uint)bVar61 * iVar40 | (uint)!bVar61 * *(int *)(local_620.ray + 0x3d0);
                      *(uint *)(local_620.ray + 0x3d4) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3d4);
                      *(uint *)(local_620.ray + 0x3d8) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x3d8);
                      *(uint *)(local_620.ray + 0x3dc) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3dc);
                      *(uint *)(local_620.ray + 0x3e0) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x3e0);
                      *(uint *)(local_620.ray + 0x3e4) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3e4);
                      *(uint *)(local_620.ray + 1000) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 1000);
                      *(uint *)(local_620.ray + 0x3ec) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3ec);
                      *(uint *)(local_620.ray + 0x3f0) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3f0);
                      *(uint *)(local_620.ray + 0x3f4) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3f4);
                      *(uint *)(local_620.ray + 0x3f8) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3f8);
                      *(uint *)(local_620.ray + 0x3fc) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x3fc);
                      iVar37 = *(int *)(local_620.hit + 0x104);
                      iVar38 = *(int *)(local_620.hit + 0x108);
                      iVar39 = *(int *)(local_620.hit + 0x10c);
                      iVar40 = *(int *)(local_620.hit + 0x110);
                      iVar41 = *(int *)(local_620.hit + 0x114);
                      iVar42 = *(int *)(local_620.hit + 0x118);
                      iVar43 = *(int *)(local_620.hit + 0x11c);
                      iVar44 = *(int *)(local_620.hit + 0x120);
                      iVar45 = *(int *)(local_620.hit + 0x124);
                      iVar46 = *(int *)(local_620.hit + 0x128);
                      iVar47 = *(int *)(local_620.hit + 300);
                      iVar48 = *(int *)(local_620.hit + 0x130);
                      iVar49 = *(int *)(local_620.hit + 0x134);
                      iVar50 = *(int *)(local_620.hit + 0x138);
                      iVar51 = *(int *)(local_620.hit + 0x13c);
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar2 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar2 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar2 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
                      bVar15 = (bool)((byte)(uVar2 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar2 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar2 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      bVar23 = SUB81(uVar2 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x400) =
                           (uint)(bVar52 & 1) * *(int *)(local_620.hit + 0x100) |
                           (uint)!(bool)(bVar52 & 1) * *(int *)(local_620.ray + 0x400);
                      *(uint *)(local_620.ray + 0x404) =
                           (uint)bVar62 * iVar37 | (uint)!bVar62 * *(int *)(local_620.ray + 0x404);
                      *(uint *)(local_620.ray + 0x408) =
                           (uint)bVar63 * iVar38 | (uint)!bVar63 * *(int *)(local_620.ray + 0x408);
                      *(uint *)(local_620.ray + 0x40c) =
                           (uint)bVar60 * iVar39 | (uint)!bVar60 * *(int *)(local_620.ray + 0x40c);
                      *(uint *)(local_620.ray + 0x410) =
                           (uint)bVar61 * iVar40 | (uint)!bVar61 * *(int *)(local_620.ray + 0x410);
                      *(uint *)(local_620.ray + 0x414) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x414);
                      *(uint *)(local_620.ray + 0x418) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x418);
                      *(uint *)(local_620.ray + 0x41c) =
                           (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_620.ray + 0x41c);
                      *(uint *)(local_620.ray + 0x420) =
                           (uint)(bVar16 & 1) * iVar44 |
                           (uint)!(bool)(bVar16 & 1) * *(int *)(local_620.ray + 0x420);
                      *(uint *)(local_620.ray + 0x424) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x424);
                      *(uint *)(local_620.ray + 0x428) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x428);
                      *(uint *)(local_620.ray + 0x42c) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x42c);
                      *(uint *)(local_620.ray + 0x430) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x430);
                      *(uint *)(local_620.ray + 0x434) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x434);
                      *(uint *)(local_620.ray + 0x438) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x438);
                      *(uint *)(local_620.ray + 0x43c) =
                           (uint)bVar23 * iVar51 | (uint)!bVar23 * *(int *)(local_620.ray + 0x43c);
                      auVar128 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x140));
                      auVar128 = vmovdqu32_avx512f(auVar128);
                      *(undefined1 (*) [64])(local_620.ray + 0x440) = auVar128;
                      auVar128 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x180));
                      auVar128 = vmovdqu32_avx512f(auVar128);
                      *(undefined1 (*) [64])(local_620.ray + 0x480) = auVar128;
                      auVar129 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x1c0));
                      auVar128 = vmovdqa32_avx512f(auVar129);
                      *(undefined1 (*) [64])(local_620.ray + 0x4c0) = auVar128;
                      auVar128 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x200));
                      bVar62 = (bool)((byte)(uVar2 >> 1) & 1);
                      auVar36._4_56_ = auVar128._8_56_;
                      auVar36._0_4_ = (uint)bVar62 * auVar128._4_4_ | (uint)!bVar62 * auVar129._4_4_
                      ;
                      auVar130._0_8_ = auVar36._0_8_ << 0x20;
                      bVar62 = (bool)((byte)(uVar2 >> 2) & 1);
                      auVar130._8_4_ =
                           (uint)bVar62 * auVar128._8_4_ | (uint)!bVar62 * auVar129._8_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 3) & 1);
                      auVar130._12_4_ =
                           (uint)bVar62 * auVar128._12_4_ | (uint)!bVar62 * auVar129._12_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 4) & 1);
                      auVar130._16_4_ =
                           (uint)bVar62 * auVar128._16_4_ | (uint)!bVar62 * auVar129._16_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 5) & 1);
                      auVar130._20_4_ =
                           (uint)bVar62 * auVar128._20_4_ | (uint)!bVar62 * auVar129._20_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 6) & 1);
                      auVar130._24_4_ =
                           (uint)bVar62 * auVar128._24_4_ | (uint)!bVar62 * auVar129._24_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 7) & 1);
                      auVar130._28_4_ =
                           (uint)bVar62 * auVar128._28_4_ | (uint)!bVar62 * auVar129._28_4_;
                      auVar130._32_4_ =
                           (uint)(bVar16 & 1) * auVar128._32_4_ |
                           (uint)!(bool)(bVar16 & 1) * auVar129._32_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 9) & 1);
                      auVar130._36_4_ =
                           (uint)bVar62 * auVar128._36_4_ | (uint)!bVar62 * auVar129._36_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 10) & 1);
                      auVar130._40_4_ =
                           (uint)bVar62 * auVar128._40_4_ | (uint)!bVar62 * auVar129._40_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 0xb) & 1);
                      auVar130._44_4_ =
                           (uint)bVar62 * auVar128._44_4_ | (uint)!bVar62 * auVar129._44_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 0xc) & 1);
                      auVar130._48_4_ =
                           (uint)bVar62 * auVar128._48_4_ | (uint)!bVar62 * auVar129._48_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 0xd) & 1);
                      auVar130._52_4_ =
                           (uint)bVar62 * auVar128._52_4_ | (uint)!bVar62 * auVar129._52_4_;
                      bVar62 = (bool)((byte)(uVar2 >> 0xe) & 1);
                      auVar130._56_4_ =
                           (uint)bVar62 * auVar128._56_4_ | (uint)!bVar62 * auVar129._56_4_;
                      bVar62 = SUB81(uVar2 >> 0xf,0);
                      auVar130._60_4_ =
                           (uint)bVar62 * auVar128._60_4_ | (uint)!bVar62 * auVar129._60_4_;
                      auVar128 = vmovdqa32_avx512f(auVar128);
                      *(undefined1 (*) [64])(local_620.ray + 0x500) = auVar128;
                      goto LAB_01a34462;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar240;
                }
              }
            }
          }
        }
      }
      goto LAB_01a34462;
    }
    auVar66 = vinsertps_avx(auVar82,auVar83,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }